

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  ZSTD_optimal_t *pZVar3;
  undefined8 *puVar4;
  ZSTD_optimal_t *pZVar5;
  rawSeqStore_t *prVar6;
  ZSTD_match_t *pZVar7;
  U32 *pUVar8;
  undefined8 uVar9;
  U32 UVar10;
  U32 i;
  uint uVar11;
  U32 UVar12;
  uint uVar13;
  int iVar14;
  U32 UVar15;
  U32 UVar16;
  int iVar17;
  uint uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  uint *puVar24;
  seqDef *psVar25;
  int iVar26;
  int iVar27;
  ZSTD_optimal_t *pZVar28;
  ulong uVar29;
  BYTE *pBVar30;
  BYTE *pBVar31;
  int bonus;
  int extraout_EDX;
  int bonus_00;
  int bonus_01;
  uint uVar32;
  ulong uVar33;
  int iVar34;
  uint *puVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  U32 *pUVar39;
  uint uVar40;
  uint *puVar41;
  ulong uVar42;
  BYTE *base;
  uint uVar43;
  ulong uVar44;
  optState_t *poVar45;
  bool bVar46;
  repcodes_t rVar47;
  uint *local_200;
  uint *local_1f8;
  uint *local_1f0;
  uint *local_1d0;
  uint *local_1c0;
  uint *local_1b8;
  uint *local_190;
  U32 nextToUpdate3_1;
  U32 *local_170;
  uint *local_168;
  U32 *local_160;
  undefined8 local_158;
  uint *local_150;
  optState_t *local_148;
  uint *local_140;
  U32 local_138 [3];
  U32 nextToUpdate3;
  uint *local_128;
  ulong local_120;
  U32 *local_118;
  U32 *local_110;
  ulong local_108;
  ulong local_100;
  U32 *local_f8;
  optState_t *local_f0;
  U32 *local_e8;
  uint *local_e0;
  U32 (*local_d8) [3];
  U32 nbMatches;
  uint *local_c8;
  ulong local_c0;
  BYTE *local_b8;
  int local_ac;
  seqStore_t *local_a8;
  ulong local_a0;
  ZSTD_optimal_t *local_98;
  undefined8 local_90;
  U32 local_88;
  U32 *local_80;
  U32 *local_78;
  uint *local_70;
  ZSTD_optLdm_t local_68;
  
  pBVar31 = (ms->window).base;
  puVar41 = (uint *)src;
  local_e0 = (uint *)src;
  local_d8 = (U32 (*) [3])rep;
  local_a8 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (uVar40 = (ms->window).dictLimit, uVar40 == (ms->window).lowLimit)) &&
     ((0x400 < srcSize && (uVar11 = (int)src - (int)pBVar31, uVar40 == uVar11)))) {
    local_138 = *(U32 (*) [3])rep;
    uVar40 = (ms->cParams).targetLength;
    uVar36 = 0xfff;
    if (uVar40 < 0xfff) {
      uVar36 = uVar40;
    }
    local_c8 = (uint *)CONCAT44(local_c8._4_4_,uVar36);
    local_f0 = &ms->opt;
    pBVar2 = (BYTE *)((long)src + srcSize);
    local_a0 = (ulong)(((ms->cParams).minMatch != 3) + 3);
    nextToUpdate3 = ms->nextToUpdate;
    pZVar5 = (ms->opt).priceTable;
    prVar6 = ms->ldmSeqStore;
    if (prVar6 == (rawSeqStore_t *)0x0) {
      local_68.seqStore.posInSequence = 0;
      local_68.seqStore.size = 0;
      local_68.seqStore.seq = (rawSeq *)0x0;
      local_68.seqStore.pos = 0;
      local_68.seqStore.capacity = 0;
    }
    else {
      local_68.seqStore.capacity = prVar6->capacity;
      local_68.seqStore.seq = prVar6->seq;
      local_68.seqStore.pos = prVar6->pos;
      local_68.seqStore.posInSequence = prVar6->posInSequence;
      local_68.seqStore.size = prVar6->size;
    }
    pZVar7 = (ms->opt).matchTable;
    local_68.offset = 0;
    local_e8 = (U32 *)((long)src + (srcSize - 8));
    local_68.startPosInBlock = 0;
    local_68.endPosInBlock = 0;
    ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
    local_80 = (U32 *)srcSize;
    ZSTD_rescaleFreqs(local_f0,(BYTE *)src,srcSize,2);
    local_1b8 = (uint *)((ulong)(pBVar31 + uVar11 == (BYTE *)src) + (long)src);
    local_c0 = (ulong)((int)local_a0 - 1);
    local_b8 = pBVar2 + -0x20;
    local_140 = (uint *)(local_a0 & 0xffffffff);
    local_98 = pZVar5 + 1;
    local_78 = pZVar5->rep;
LAB_001e9358:
    local_70 = (uint *)src;
LAB_001e936b:
    if (local_1b8 < local_e8) {
      iVar26 = (int)local_1b8;
      local_158 = (ulong)(uint)(iVar26 - (int)local_70);
      pBVar31 = (ms->window).base;
      uVar42 = (ulong)ms->nextToUpdate;
      uVar40 = 0;
      if (pBVar31 + uVar42 <= local_1b8) {
        UVar15 = (ms->cParams).minMatch;
        uVar40 = iVar26 - (int)pBVar31;
        for (; (uint)uVar42 < uVar40; uVar42 = (ulong)((uint)uVar42 + UVar12)) {
          UVar12 = ZSTD_insertBt1(ms,pBVar31 + uVar42,pBVar2,UVar15,0);
        }
        ms->nextToUpdate = uVar40;
        if (UVar15 - 6 < 2) {
          bVar46 = (U32)local_158 == 0;
          uVar42 = (ulong)(uint)bVar46;
          uVar11 = (ms->cParams).targetLength;
          if (0xffe < uVar11) {
            uVar11 = 0xfff;
          }
          pBVar31 = (ms->window).base;
          uVar37 = iVar26 - (int)pBVar31;
          uVar33 = 0;
          local_170 = (U32 *)((ulong)(*(long *)local_1b8 * -0x30e4432340650000) >>
                             (-(char)(ms->cParams).hashLog & 0x3fU));
          uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar36 = uVar37 - uVar13;
          if (uVar37 < uVar13) {
            uVar36 = 0;
          }
          local_150 = ms->chainTable;
          uVar40 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar15 = (ms->window).lowLimit;
          UVar12 = uVar37 - uVar40;
          if (uVar37 - UVar15 <= uVar40) {
            UVar12 = UVar15;
          }
          if (ms->loadedDictEnd != 0) {
            UVar12 = UVar15;
          }
          uVar44 = (ulong)((uVar13 & uVar37) * 2);
          local_1f0 = local_150 + uVar44;
          local_200 = local_150 + uVar44 + 1;
          iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar15 = (ms->window).dictLimit;
          uVar38 = local_138[0] - 1;
          local_160 = ms->hashTable;
          UVar16 = local_160[(long)local_170];
          iVar34 = uVar37 + 9;
          uVar44 = uVar42 + 3;
          local_148 = (optState_t *)(local_1b8 + 1);
          local_168 = (uint *)CONCAT44(local_168._4_4_,uVar11);
          uVar21 = local_c0;
          for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
            uVar40 = uVar38;
            if (uVar42 != 3) {
              uVar40 = local_138[uVar42];
            }
            uVar20 = 0;
            if (((uVar40 - 1 < uVar37 - UVar15) && (UVar12 <= uVar37 - uVar40)) &&
               (*local_1b8 == *(uint *)((long)local_1b8 - (ulong)uVar40))) {
              sVar19 = ZSTD_count((BYTE *)local_148,(BYTE *)((long)local_148 - (ulong)uVar40),pBVar2
                                 );
              uVar20 = (ulong)((int)sVar19 + 4);
              uVar11 = (uint)local_168;
            }
            if (uVar21 < uVar20) {
              pZVar7[uVar33].off = (int)uVar42 - (uint)bVar46;
              pZVar7[uVar33].len = (uint)uVar20;
              uVar40 = (int)uVar33 + 1;
              uVar33 = (ulong)uVar40;
              puVar41 = local_e0;
              if ((uVar11 < (uint)uVar20) ||
                 (uVar21 = uVar20, (BYTE *)((long)local_1b8 + uVar20) == pBVar2)) goto LAB_001ea41d;
            }
          }
          local_160[(long)local_170] = uVar37;
          uVar42 = 0;
          uVar44 = 0;
LAB_001e989d:
          uVar40 = (uint)uVar33;
          bVar46 = iVar17 == 0;
          iVar17 = iVar17 + -1;
          iVar14 = iVar34;
          if ((bVar46) || (UVar16 < UVar12 + (UVar12 == 0))) goto LAB_001ea3c3;
          uVar20 = uVar44;
          if (uVar42 < uVar44) {
            uVar20 = uVar42;
          }
          sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + uVar20),pBVar31 + uVar20 + UVar16,pBVar2);
          uVar20 = sVar19 + uVar20;
          if (uVar21 < uVar20) {
            iVar14 = (U32)uVar20 + UVar16;
            if (uVar20 <= iVar34 - UVar16) {
              iVar14 = iVar34;
            }
            pZVar7[uVar33].off = (uVar37 + 2) - UVar16;
            pZVar7[uVar33].len = (U32)uVar20;
            uVar40 = uVar40 + 1;
            uVar33 = (ulong)uVar40;
            if ((0x1000 < uVar20) ||
               (uVar21 = uVar20, iVar34 = iVar14, (BYTE *)((long)local_1b8 + uVar20) == pBVar2))
            goto LAB_001ea3c3;
          }
          uVar40 = (uint)uVar33;
          puVar41 = local_150 + (UVar16 & uVar13) * 2;
          iVar14 = iVar34;
          if (*(byte *)((long)local_1b8 + uVar20) <= pBVar31[uVar20 + UVar16]) {
            *local_200 = UVar16;
            local_200 = puVar41;
            if (UVar16 <= uVar36) {
              local_200 = &nextToUpdate3_1;
              goto LAB_001ea3c3;
            }
LAB_001e99cf:
            UVar16 = *puVar41;
            uVar44 = uVar20;
            goto LAB_001e989d;
          }
          *local_1f0 = UVar16;
          if (uVar36 < UVar16) {
            puVar41 = puVar41 + 1;
            uVar42 = uVar20;
            uVar20 = uVar44;
            local_1f0 = puVar41;
            goto LAB_001e99cf;
          }
          local_1f0 = &nextToUpdate3_1;
LAB_001ea3c3:
          *local_200 = 0;
          *local_1f0 = 0;
          ms->nextToUpdate = iVar14 - 8;
          puVar41 = local_e0;
          goto LAB_001ea41d;
        }
        if (UVar15 == 5) {
          bVar46 = (U32)local_158 == 0;
          uVar42 = (ulong)(uint)bVar46;
          uVar11 = (ms->cParams).targetLength;
          if (0xffe < uVar11) {
            uVar11 = 0xfff;
          }
          pBVar31 = (ms->window).base;
          uVar37 = iVar26 - (int)pBVar31;
          uVar33 = 0;
          local_170 = (U32 *)((ulong)(*(long *)local_1b8 * -0x30e4432345000000) >>
                             (-(char)(ms->cParams).hashLog & 0x3fU));
          uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar36 = uVar37 - uVar13;
          if (uVar37 < uVar13) {
            uVar36 = 0;
          }
          local_150 = ms->chainTable;
          uVar40 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar15 = (ms->window).lowLimit;
          UVar12 = uVar37 - uVar40;
          if (uVar37 - UVar15 <= uVar40) {
            UVar12 = UVar15;
          }
          if (ms->loadedDictEnd != 0) {
            UVar12 = UVar15;
          }
          uVar44 = (ulong)((uVar13 & uVar37) * 2);
          local_1f0 = local_150 + uVar44;
          local_200 = local_150 + uVar44 + 1;
          iVar34 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar15 = (ms->window).dictLimit;
          uVar38 = local_138[0] - 1;
          local_160 = ms->hashTable;
          puVar35 = (uint *)(ulong)local_160[(long)local_170];
          uVar44 = uVar42 + 3;
          local_148 = (optState_t *)(local_1b8 + 1);
          uVar21 = local_c0;
          local_168 = puVar35;
          for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
            uVar40 = uVar38;
            if (uVar42 != 3) {
              uVar40 = local_138[uVar42];
            }
            uVar20 = 0;
            if (((uVar40 - 1 < uVar37 - UVar15) && (UVar12 <= uVar37 - uVar40)) &&
               (*local_1b8 == *(uint *)((long)local_1b8 - (ulong)uVar40))) {
              sVar19 = ZSTD_count((BYTE *)local_148,(BYTE *)((long)local_148 - (ulong)uVar40),pBVar2
                                 );
              uVar20 = (ulong)((int)sVar19 + 4);
              puVar35 = local_168;
            }
            if (uVar21 < uVar20) {
              pZVar7[uVar33].off = (int)uVar42 - (uint)bVar46;
              pZVar7[uVar33].len = (uint)uVar20;
              uVar40 = (int)uVar33 + 1;
              uVar33 = (ulong)uVar40;
              puVar41 = local_e0;
              if ((uVar11 < (uint)uVar20) ||
                 (uVar21 = uVar20, (BYTE *)((long)local_1b8 + uVar20) == pBVar2)) goto LAB_001ea41d;
            }
          }
          local_160[(long)local_170] = uVar37;
          uVar42 = 0;
          uVar44 = 0;
          iVar17 = uVar37 + 9;
          while( true ) {
            uVar40 = (uint)uVar33;
            bVar46 = iVar34 == 0;
            iVar34 = iVar34 + -1;
            iVar14 = iVar17;
            if ((bVar46) || (uVar11 = (uint)puVar35, uVar11 < UVar12 + (UVar12 == 0))) break;
            uVar20 = uVar44;
            if (uVar42 < uVar44) {
              uVar20 = uVar42;
            }
            sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + uVar20),
                                pBVar31 + uVar20 + ((ulong)puVar35 & 0xffffffff),pBVar2);
            uVar20 = sVar19 + uVar20;
            if (uVar21 < uVar20) {
              iVar14 = (U32)uVar20 + uVar11;
              if (uVar20 <= iVar17 - uVar11) {
                iVar14 = iVar17;
              }
              pZVar7[uVar33].off = (uVar37 + 2) - uVar11;
              pZVar7[uVar33].len = (U32)uVar20;
              uVar40 = uVar40 + 1;
              uVar33 = (ulong)uVar40;
              if ((0x1000 < uVar20) ||
                 (uVar21 = uVar20, (BYTE *)((long)local_1b8 + uVar20) == pBVar2)) break;
            }
            uVar40 = (uint)uVar33;
            puVar41 = local_150 + (uVar11 & uVar13) * 2;
            if (pBVar31[uVar20 + ((ulong)puVar35 & 0xffffffff)] <
                *(byte *)((long)local_1b8 + uVar20)) {
              *local_1f0 = uVar11;
              if (uVar11 <= uVar36) goto LAB_001ea209;
              puVar41 = puVar41 + 1;
              uVar42 = uVar20;
              uVar20 = uVar44;
              local_1f0 = puVar41;
            }
            else {
              *local_200 = uVar11;
              local_200 = puVar41;
              if (uVar11 <= uVar36) goto LAB_001ea38a;
            }
            puVar35 = (uint *)(ulong)*puVar41;
            uVar44 = uVar20;
            iVar17 = iVar14;
          }
          goto LAB_001ea3fc;
        }
        if (UVar15 != 3) {
          bVar46 = (U32)local_158 == 0;
          uVar42 = (ulong)(uint)bVar46;
          uVar11 = (ms->cParams).targetLength;
          if (0xffe < uVar11) {
            uVar11 = 0xfff;
          }
          pBVar31 = (ms->window).base;
          uVar37 = iVar26 - (int)pBVar31;
          uVar33 = 0;
          local_170 = (U32 *)(ulong)(*local_1b8 * -0x61c8864f >>
                                    (-(char)(ms->cParams).hashLog & 0x1fU));
          uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar36 = uVar37 - uVar13;
          if (uVar37 < uVar13) {
            uVar36 = 0;
          }
          local_150 = ms->chainTable;
          uVar40 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          UVar15 = (ms->window).lowLimit;
          UVar12 = uVar37 - uVar40;
          if (uVar37 - UVar15 <= uVar40) {
            UVar12 = UVar15;
          }
          if (ms->loadedDictEnd != 0) {
            UVar12 = UVar15;
          }
          uVar44 = (ulong)((uVar13 & uVar37) * 2);
          local_1f0 = local_150 + uVar44;
          local_200 = local_150 + uVar44 + 1;
          iVar34 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar15 = (ms->window).dictLimit;
          uVar38 = local_138[0] - 1;
          local_160 = ms->hashTable;
          puVar35 = (uint *)(ulong)local_160[(long)local_170];
          uVar44 = uVar42 + 3;
          local_148 = (optState_t *)(local_1b8 + 1);
          uVar21 = local_c0;
          local_168 = puVar35;
          for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
            uVar40 = uVar38;
            if (uVar42 != 3) {
              uVar40 = local_138[uVar42];
            }
            uVar20 = 0;
            if (((uVar40 - 1 < uVar37 - UVar15) && (UVar12 <= uVar37 - uVar40)) &&
               (*local_1b8 == *(uint *)((long)local_1b8 - (ulong)uVar40))) {
              sVar19 = ZSTD_count((BYTE *)local_148,(BYTE *)((long)local_148 - (ulong)uVar40),pBVar2
                                 );
              uVar20 = (ulong)((int)sVar19 + 4);
              puVar35 = local_168;
            }
            if (uVar21 < uVar20) {
              pZVar7[uVar33].off = (int)uVar42 - (uint)bVar46;
              pZVar7[uVar33].len = (uint)uVar20;
              uVar40 = (int)uVar33 + 1;
              uVar33 = (ulong)uVar40;
              puVar41 = local_e0;
              if ((uVar11 < (uint)uVar20) ||
                 (uVar21 = uVar20, (BYTE *)((long)local_1b8 + uVar20) == pBVar2)) goto LAB_001ea41d;
            }
          }
          local_160[(long)local_170] = uVar37;
          uVar42 = 0;
          uVar44 = 0;
          iVar17 = uVar37 + 9;
          while( true ) {
            uVar40 = (uint)uVar33;
            bVar46 = iVar34 == 0;
            iVar34 = iVar34 + -1;
            iVar14 = iVar17;
            if ((bVar46) || (uVar11 = (uint)puVar35, uVar11 < UVar12 + (UVar12 == 0))) break;
            uVar20 = uVar44;
            if (uVar42 < uVar44) {
              uVar20 = uVar42;
            }
            sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + uVar20),
                                pBVar31 + uVar20 + ((ulong)puVar35 & 0xffffffff),pBVar2);
            uVar20 = sVar19 + uVar20;
            if (uVar21 < uVar20) {
              iVar14 = (U32)uVar20 + uVar11;
              if (uVar20 <= iVar17 - uVar11) {
                iVar14 = iVar17;
              }
              pZVar7[uVar33].off = (uVar37 + 2) - uVar11;
              pZVar7[uVar33].len = (U32)uVar20;
              uVar40 = uVar40 + 1;
              uVar33 = (ulong)uVar40;
              if ((0x1000 < uVar20) ||
                 (uVar21 = uVar20, (BYTE *)((long)local_1b8 + uVar20) == pBVar2)) break;
            }
            uVar40 = (uint)uVar33;
            puVar41 = local_150 + (uVar11 & uVar13) * 2;
            if (pBVar31[uVar20 + ((ulong)puVar35 & 0xffffffff)] <
                *(byte *)((long)local_1b8 + uVar20)) {
              *local_1f0 = uVar11;
              if (uVar11 <= uVar36) goto LAB_001ea209;
              puVar41 = puVar41 + 1;
              uVar42 = uVar20;
              uVar20 = uVar44;
              local_1f0 = puVar41;
            }
            else {
              *local_200 = uVar11;
              local_200 = puVar41;
              if (uVar11 <= uVar36) goto LAB_001ea38a;
            }
            puVar35 = (uint *)(ulong)*puVar41;
            uVar44 = uVar20;
            iVar17 = iVar14;
          }
          goto LAB_001ea3fc;
        }
        bVar46 = (U32)local_158 == 0;
        uVar42 = (ulong)bVar46;
        uVar40 = (ms->cParams).targetLength;
        if (0xffe < uVar40) {
          uVar40 = 0xfff;
        }
        uVar44 = (ulong)uVar40;
        pBVar31 = (ms->window).base;
        uVar36 = iVar26 - (int)pBVar31;
        uVar33 = 0;
        local_170 = (U32 *)(ulong)(*local_1b8 * -0x61c8864f >>
                                  (-(char)(ms->cParams).hashLog & 0x1fU));
        uVar37 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar11 = uVar36 - uVar37;
        if (uVar36 < uVar37) {
          uVar11 = 0;
        }
        pUVar8 = ms->chainTable;
        uVar13 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        UVar15 = (ms->window).lowLimit;
        UVar12 = uVar36 - uVar13;
        if (uVar36 - UVar15 <= uVar13) {
          UVar12 = UVar15;
        }
        if (ms->loadedDictEnd != 0) {
          UVar12 = UVar15;
        }
        uVar13 = UVar12 + (UVar12 == 0);
        uVar21 = (ulong)((uVar37 & uVar36) * 2);
        local_1f0 = pUVar8 + uVar21;
        local_1f8 = pUVar8 + uVar21 + 1;
        iVar34 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar15 = (ms->window).dictLimit;
        uVar38 = local_138[0] - 1;
        local_160 = ms->hashTable;
        local_148 = (optState_t *)(ulong)local_160[(long)local_170];
        iVar14 = uVar36 + 9;
        uVar21 = uVar42 + 3;
        local_150 = (uint *)CONCAT44(local_150._4_4_,UVar12);
        local_168 = (uint *)CONCAT44(local_168._4_4_,uVar40);
        uVar20 = local_c0;
        for (; uVar42 < uVar21; uVar42 = uVar42 + 1) {
          uVar40 = uVar38;
          if (uVar42 != 3) {
            uVar40 = local_138[uVar42];
          }
          uVar23 = 0;
          if (((uVar40 - 1 < uVar36 - UVar15) && (UVar12 <= uVar36 - uVar40)) &&
             (((*(uint *)((long)local_1b8 - (ulong)uVar40) ^ *local_1b8) & 0xffffff) == 0)) {
            sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + 3),
                                (BYTE *)((long)local_1b8 + 3) + -(ulong)uVar40,pBVar2);
            uVar44 = (ulong)local_168 & 0xffffffff;
            uVar23 = (ulong)((int)sVar19 + 3);
            UVar12 = (uint)local_150;
          }
          if (uVar20 < uVar23) {
            pZVar7[uVar33].off = (int)uVar42 - (uint)bVar46;
            pZVar7[uVar33].len = (uint)uVar23;
            uVar40 = (int)uVar33 + 1;
            uVar33 = (ulong)uVar40;
            puVar41 = local_e0;
            if (((uint)uVar44 < (uint)uVar23) ||
               (uVar20 = uVar23, (BYTE *)((long)local_1b8 + uVar23) == pBVar2)) goto LAB_001ea41d;
          }
        }
        if (((2 < uVar20) ||
            (UVar15 = ZSTD_insertAndFindFirstIndexHash3(ms,&nextToUpdate3,(BYTE *)local_1b8),
            UVar15 < uVar13)) ||
           ((0x3ffff < uVar36 - UVar15 ||
            (sVar19 = ZSTD_count((BYTE *)local_1b8,pBVar31 + UVar15,pBVar2), sVar19 < 3)))) {
LAB_001ea22c:
          local_160[(long)local_170] = uVar36;
          uVar42 = 0;
          poVar45 = local_148;
          uVar44 = 0;
          do {
            uVar40 = (uint)uVar33;
            bVar46 = iVar34 == 0;
            iVar34 = iVar34 + -1;
            local_200 = local_1f8;
            if ((bVar46) || (uVar38 = (uint)poVar45, uVar38 < uVar13)) goto LAB_001ea3fc;
            uVar21 = uVar44;
            if (uVar42 < uVar44) {
              uVar21 = uVar42;
            }
            sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + uVar21),
                                pBVar31 + uVar21 + ((ulong)poVar45 & 0xffffffff),pBVar2);
            uVar21 = sVar19 + uVar21;
            if (uVar20 < uVar21) {
              iVar17 = uVar38 + (U32)uVar21;
              if (uVar21 <= iVar14 - uVar38) {
                iVar17 = iVar14;
              }
              iVar14 = iVar17;
              pZVar7[uVar33].off = (uVar36 + 2) - uVar38;
              pZVar7[uVar33].len = (U32)uVar21;
              uVar40 = uVar40 + 1;
              uVar33 = (ulong)uVar40;
              if ((0x1000 < uVar21) ||
                 (uVar20 = uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2)) goto LAB_001ea3fc;
            }
            uVar40 = (uint)uVar33;
            puVar41 = pUVar8 + (uVar38 & uVar37) * 2;
            if (pBVar31[uVar21 + ((ulong)poVar45 & 0xffffffff)] <
                *(byte *)((long)local_1b8 + uVar21)) {
              *local_1f0 = uVar38;
              if (uVar38 <= uVar11) {
                local_1f0 = &nextToUpdate3_1;
                goto LAB_001ea3fc;
              }
              puVar41 = puVar41 + 1;
              uVar42 = uVar21;
              uVar21 = uVar44;
              local_1f0 = puVar41;
            }
            else {
              *local_1f8 = uVar38;
              local_1f8 = puVar41;
              if (uVar38 <= uVar11) goto LAB_001ea38a;
            }
            poVar45 = (optState_t *)(ulong)*puVar41;
            uVar44 = uVar21;
          } while( true );
        }
        pZVar7->off = (uVar36 - UVar15) + 2;
        pZVar7->len = (U32)sVar19;
        uVar33 = 1;
        uVar40 = 1;
        uVar20 = sVar19;
        if (sVar19 <= uVar44 && (BYTE *)(sVar19 + (long)local_1b8) != pBVar2) goto LAB_001ea22c;
        UVar15 = uVar36 + 1;
        goto LAB_001ea405;
      }
      goto LAB_001ea41d;
    }
    ZSTD_resetSeqStore(local_a8);
    ppBVar1 = &(ms->window).base;
    *ppBVar1 = *ppBVar1 + -(long)local_80;
    UVar15 = (ms->window).dictLimit + (int)local_80;
    (ms->window).dictLimit = UVar15;
    (ms->window).lowLimit = UVar15;
    ms->nextToUpdate = UVar15;
    iVar26 = bonus;
    if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
      UVar15 = ZSTD_upscaleStat((ms->opt).litFreq,0xff,bonus);
      (ms->opt).litSum = UVar15;
      iVar26 = extraout_EDX;
    }
    UVar15 = ZSTD_upscaleStat((ms->opt).litLengthFreq,0x23,iVar26);
    (ms->opt).litLengthSum = UVar15;
    UVar15 = ZSTD_upscaleStat((ms->opt).matchLengthFreq,0x34,bonus_00);
    (ms->opt).matchLengthSum = UVar15;
    UVar15 = ZSTD_upscaleStat((ms->opt).offCodeFreq,0x1f,bonus_01);
    (ms->opt).offCodeSum = UVar15;
    pBVar31 = (ms->window).base;
    srcSize = (size_t)local_80;
  }
  uVar40 = (ms->window).dictLimit;
  uVar11 = (ms->cParams).targetLength;
  uVar36 = 0xfff;
  if (uVar11 < 0xfff) {
    uVar36 = uVar11;
  }
  local_78 = (U32 *)CONCAT44(local_78._4_4_,uVar36);
  local_148 = &ms->opt;
  pBVar2 = (BYTE *)((long)puVar41 + srcSize);
  local_a0 = (ulong)(((ms->cParams).minMatch != 3) + 3);
  nextToUpdate3_1 = ms->nextToUpdate;
  pZVar5 = (ms->opt).priceTable;
  prVar6 = ms->ldmSeqStore;
  if (prVar6 == (rawSeqStore_t *)0x0) {
    local_68.seqStore.posInSequence = 0;
    local_68.seqStore.size = 0;
    local_68.seqStore.seq = (rawSeq *)0x0;
    local_68.seqStore.pos = 0;
    local_68.seqStore.capacity = 0;
  }
  else {
    local_68.seqStore.capacity = prVar6->capacity;
    local_68.seqStore.seq = prVar6->seq;
    local_68.seqStore.pos = prVar6->pos;
    local_68.seqStore.posInSequence = prVar6->posInSequence;
    local_68.seqStore.size = prVar6->size;
  }
  pZVar7 = (ms->opt).matchTable;
  local_68.offset = 0;
  local_150 = (uint *)((long)puVar41 + (srcSize - 8));
  local_68.startPosInBlock = 0;
  local_68.endPosInBlock = 0;
  ZSTD_opt_getNextMatchAndUpdateSeqStore(&local_68,0,(U32)srcSize);
  ZSTD_rescaleFreqs(local_148,(BYTE *)puVar41,srcSize,2);
  local_1b8 = (uint *)((ulong)((uint *)(pBVar31 + uVar40) == puVar41) + (long)puVar41);
  local_b8 = (BYTE *)(ulong)((int)local_a0 - 1);
  local_70 = (uint *)(pBVar2 + -0x20);
  local_c0 = local_a0 & 0xffffffff;
  local_98 = pZVar5 + 1;
  local_80 = pZVar5->rep;
  local_f0 = (optState_t *)puVar41;
LAB_001ec08d:
  if (local_150 <= local_1b8) {
    return (long)pBVar2 - (long)local_f0;
  }
  iVar26 = (int)local_1b8;
  local_158._0_4_ = iVar26 - (int)local_f0;
  local_158._4_4_ = 0;
  pBVar31 = (ms->window).base;
  uVar42 = (ulong)ms->nextToUpdate;
  uVar40 = 0;
  if (pBVar31 + uVar42 <= local_1b8) {
    UVar15 = (ms->cParams).minMatch;
    uVar40 = iVar26 - (int)pBVar31;
    for (; (uint)uVar42 < uVar40; uVar42 = (ulong)((uint)uVar42 + UVar12)) {
      UVar12 = ZSTD_insertBt1(ms,pBVar31 + uVar42,pBVar2,UVar15,0);
    }
    ms->nextToUpdate = uVar40;
    if (UVar15 - 6 < 2) {
      uVar42 = (ulong)((U32)local_158 == 0);
      uVar11 = (ms->cParams).targetLength;
      if (0xffe < uVar11) {
        uVar11 = 0xfff;
      }
      pBVar31 = (ms->window).base;
      uVar37 = iVar26 - (int)pBVar31;
      uVar33 = 0;
      local_140 = (uint *)((ulong)(*(long *)local_1b8 * -0x30e4432340650000) >>
                          (-(char)(ms->cParams).hashLog & 0x3fU));
      uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar36 = uVar37 - uVar13;
      if (uVar37 < uVar13) {
        uVar36 = 0;
      }
      uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar40 = (ms->window).lowLimit;
      uVar38 = uVar37 - uVar43;
      if (uVar37 - uVar40 <= uVar43) {
        uVar38 = uVar40;
      }
      pUVar8 = ms->chainTable;
      if (ms->loadedDictEnd != 0) {
        uVar38 = uVar40;
      }
      uVar44 = (ulong)((uVar13 & uVar37) * 2);
      local_1c0 = pUVar8 + uVar44;
      local_200 = pUVar8 + uVar44 + 1;
      UVar15 = (ms->window).dictLimit;
      iVar34 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      pUVar39 = (U32 *)(ulong)-(uint)((U32)local_158 == 0);
      local_170 = ms->hashTable;
      UVar12 = local_170[(long)local_140];
      uVar44 = uVar42 + 3;
      local_168 = local_1b8 + 1;
      pBVar30 = local_b8;
      local_e8 = pUVar39;
      for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
        if (uVar42 == 3) {
          uVar40 = (*local_d8)[0] - 1;
        }
        else {
          uVar40 = (*local_d8)[uVar42];
        }
        uVar43 = 0;
        if (((uVar40 - 1 < uVar37 - UVar15) && (uVar43 = 0, uVar38 <= uVar37 - uVar40)) &&
           (*local_1b8 == *(uint *)((long)local_1b8 - (ulong)uVar40))) {
          sVar19 = ZSTD_count((BYTE *)local_168,(BYTE *)((long)local_168 - (ulong)uVar40),pBVar2);
          uVar43 = (int)sVar19 + 4;
          pUVar39 = local_e8;
        }
        uVar21 = (ulong)uVar43;
        if (pBVar30 < uVar21) {
          pZVar7[uVar33].off = (int)pUVar39 + (int)uVar42;
          pZVar7[uVar33].len = uVar43;
          uVar40 = (int)uVar33 + 1;
          uVar33 = (ulong)uVar40;
          puVar41 = local_e0;
          if ((uVar11 < uVar43) ||
             (pBVar30 = (BYTE *)uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2))
          goto LAB_001ed0c0;
        }
      }
      local_170[(long)local_140] = uVar37;
      uVar42 = 0;
      uVar44 = 0;
      iVar17 = uVar37 + 9;
      while( true ) {
        uVar40 = (uint)uVar33;
        bVar46 = iVar34 == 0;
        iVar34 = iVar34 + -1;
        local_1f0 = local_1c0;
        iVar14 = iVar17;
        if ((bVar46) || (UVar12 < uVar38 + (uVar38 == 0))) break;
        uVar21 = uVar44;
        if (uVar42 < uVar44) {
          uVar21 = uVar42;
        }
        sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + uVar21),pBVar31 + uVar21 + UVar12,pBVar2);
        uVar21 = sVar19 + uVar21;
        if (pBVar30 < uVar21) {
          iVar14 = (U32)uVar21 + UVar12;
          if (uVar21 <= iVar17 - UVar12) {
            iVar14 = iVar17;
          }
          pZVar7[uVar33].off = (uVar37 + 2) - UVar12;
          pZVar7[uVar33].len = (U32)uVar21;
          uVar40 = uVar40 + 1;
          uVar33 = (ulong)uVar40;
          if ((0x1000 < uVar21) ||
             (pBVar30 = (BYTE *)uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2)) break;
        }
        uVar40 = (uint)uVar33;
        puVar41 = pUVar8 + (UVar12 & uVar13) * 2;
        if (pBVar31[uVar21 + UVar12] < *(byte *)((long)local_1b8 + uVar21)) {
          *local_1c0 = UVar12;
          if (UVar12 <= uVar36) goto LAB_001eced8;
          puVar41 = puVar41 + 1;
          uVar42 = uVar21;
          uVar21 = uVar44;
          local_1c0 = puVar41;
        }
        else {
          *local_200 = UVar12;
          local_200 = puVar41;
          if (UVar12 <= uVar36) goto LAB_001eceec;
        }
        UVar12 = *puVar41;
        uVar44 = uVar21;
        iVar17 = iVar14;
      }
      goto LAB_001ed0a2;
    }
    if (UVar15 == 5) {
      bVar46 = (U32)local_158 == 0;
      uVar42 = (ulong)bVar46;
      uVar11 = (ms->cParams).targetLength;
      if (0xffe < uVar11) {
        uVar11 = 0xfff;
      }
      pBVar31 = (ms->window).base;
      uVar37 = iVar26 - (int)pBVar31;
      uVar33 = 0;
      local_140 = (uint *)((ulong)(*(long *)local_1b8 * -0x30e4432345000000) >>
                          (-(char)(ms->cParams).hashLog & 0x3fU));
      uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar36 = uVar37 - uVar13;
      if (uVar37 < uVar13) {
        uVar36 = 0;
      }
      uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar40 = (ms->window).lowLimit;
      uVar38 = uVar37 - uVar43;
      if (uVar37 - uVar40 <= uVar43) {
        uVar38 = uVar40;
      }
      pUVar8 = ms->chainTable;
      if (ms->loadedDictEnd != 0) {
        uVar38 = uVar40;
      }
      uVar44 = (ulong)((uVar13 & uVar37) * 2);
      local_1c0 = pUVar8 + uVar44;
      local_200 = pUVar8 + uVar44 + 1;
      UVar15 = (ms->window).dictLimit;
      iVar34 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      local_170 = ms->hashTable;
      pUVar39 = (U32 *)(ulong)local_170[(long)local_140];
      uVar44 = uVar42 + 3;
      local_168 = local_1b8 + 1;
      pBVar30 = local_b8;
      local_e8 = pUVar39;
      for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
        if (uVar42 == 3) {
          uVar40 = (*local_d8)[0] - 1;
        }
        else {
          uVar40 = (*local_d8)[uVar42];
        }
        uVar43 = 0;
        if (((uVar40 - 1 < uVar37 - UVar15) && (uVar43 = 0, uVar38 <= uVar37 - uVar40)) &&
           (*local_1b8 == *(uint *)((long)local_1b8 - (ulong)uVar40))) {
          sVar19 = ZSTD_count((BYTE *)local_168,(BYTE *)((long)local_168 - (ulong)uVar40),pBVar2);
          uVar43 = (int)sVar19 + 4;
          pUVar39 = local_e8;
        }
        uVar21 = (ulong)uVar43;
        if (pBVar30 < uVar21) {
          pZVar7[uVar33].off = (int)uVar42 - (uint)bVar46;
          pZVar7[uVar33].len = uVar43;
          uVar40 = (int)uVar33 + 1;
          uVar33 = (ulong)uVar40;
          puVar41 = local_e0;
          if ((uVar11 < uVar43) ||
             (pBVar30 = (BYTE *)uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2))
          goto LAB_001ed0c0;
        }
      }
      local_170[(long)local_140] = uVar37;
      uVar42 = 0;
      uVar44 = 0;
      iVar17 = uVar37 + 9;
      while( true ) {
        uVar40 = (uint)uVar33;
        bVar46 = iVar34 == 0;
        iVar34 = iVar34 + -1;
        local_1f0 = local_1c0;
        iVar14 = iVar17;
        if ((bVar46) || (uVar11 = (uint)pUVar39, uVar11 < uVar38 + (uVar38 == 0))) break;
        uVar21 = uVar44;
        if (uVar42 < uVar44) {
          uVar21 = uVar42;
        }
        sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + uVar21),
                            pBVar31 + uVar21 + ((ulong)pUVar39 & 0xffffffff),pBVar2);
        uVar21 = sVar19 + uVar21;
        if (pBVar30 < uVar21) {
          iVar14 = (U32)uVar21 + uVar11;
          if (uVar21 <= iVar17 - uVar11) {
            iVar14 = iVar17;
          }
          pZVar7[uVar33].off = (uVar37 + 2) - uVar11;
          pZVar7[uVar33].len = (U32)uVar21;
          uVar40 = uVar40 + 1;
          uVar33 = (ulong)uVar40;
          if ((0x1000 < uVar21) ||
             (pBVar30 = (BYTE *)uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2)) break;
        }
        uVar40 = (uint)uVar33;
        puVar41 = pUVar8 + (uVar11 & uVar13) * 2;
        if (pBVar31[uVar21 + ((ulong)pUVar39 & 0xffffffff)] < *(byte *)((long)local_1b8 + uVar21)) {
          *local_1c0 = uVar11;
          if (uVar11 <= uVar36) goto LAB_001eced8;
          puVar41 = puVar41 + 1;
          uVar42 = uVar21;
          uVar21 = uVar44;
          local_1c0 = puVar41;
        }
        else {
          *local_200 = uVar11;
          local_200 = puVar41;
          if (uVar11 <= uVar36) goto LAB_001eceec;
        }
        pUVar39 = (U32 *)(ulong)*puVar41;
        uVar44 = uVar21;
        iVar17 = iVar14;
      }
      goto LAB_001ed0a2;
    }
    if (UVar15 != 3) {
      bVar46 = (U32)local_158 == 0;
      uVar42 = (ulong)bVar46;
      uVar11 = (ms->cParams).targetLength;
      if (0xffe < uVar11) {
        uVar11 = 0xfff;
      }
      pBVar31 = (ms->window).base;
      uVar37 = iVar26 - (int)pBVar31;
      uVar33 = 0;
      local_140 = (uint *)(ulong)(*local_1b8 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU)
                                 );
      uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar36 = uVar37 - uVar13;
      if (uVar37 < uVar13) {
        uVar36 = 0;
      }
      uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar40 = (ms->window).lowLimit;
      uVar38 = uVar37 - uVar43;
      if (uVar37 - uVar40 <= uVar43) {
        uVar38 = uVar40;
      }
      pUVar8 = ms->chainTable;
      if (ms->loadedDictEnd != 0) {
        uVar38 = uVar40;
      }
      uVar44 = (ulong)((uVar13 & uVar37) * 2);
      local_1c0 = pUVar8 + uVar44;
      local_200 = pUVar8 + uVar44 + 1;
      UVar15 = (ms->window).dictLimit;
      iVar34 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      local_170 = ms->hashTable;
      pUVar39 = (U32 *)(ulong)local_170[(long)local_140];
      uVar44 = uVar42 + 3;
      local_168 = local_1b8 + 1;
      pBVar30 = local_b8;
      local_e8 = pUVar39;
      for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
        if (uVar42 == 3) {
          uVar40 = (*local_d8)[0] - 1;
        }
        else {
          uVar40 = (*local_d8)[uVar42];
        }
        uVar43 = 0;
        if (((uVar40 - 1 < uVar37 - UVar15) && (uVar43 = 0, uVar38 <= uVar37 - uVar40)) &&
           (*local_1b8 == *(uint *)((long)local_1b8 - (ulong)uVar40))) {
          sVar19 = ZSTD_count((BYTE *)local_168,(BYTE *)((long)local_168 - (ulong)uVar40),pBVar2);
          uVar43 = (int)sVar19 + 4;
          pUVar39 = local_e8;
        }
        uVar21 = (ulong)uVar43;
        if (pBVar30 < uVar21) {
          pZVar7[uVar33].off = (int)uVar42 - (uint)bVar46;
          pZVar7[uVar33].len = uVar43;
          uVar40 = (int)uVar33 + 1;
          uVar33 = (ulong)uVar40;
          puVar41 = local_e0;
          if ((uVar11 < uVar43) ||
             (pBVar30 = (BYTE *)uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2))
          goto LAB_001ed0c0;
        }
      }
      local_170[(long)local_140] = uVar37;
      uVar42 = 0;
      uVar44 = 0;
      iVar17 = uVar37 + 9;
      while( true ) {
        uVar40 = (uint)uVar33;
        bVar46 = iVar34 == 0;
        iVar34 = iVar34 + -1;
        local_1f0 = local_1c0;
        iVar14 = iVar17;
        if ((bVar46) || (uVar11 = (uint)pUVar39, uVar11 < uVar38 + (uVar38 == 0))) break;
        uVar21 = uVar44;
        if (uVar42 < uVar44) {
          uVar21 = uVar42;
        }
        sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + uVar21),
                            pBVar31 + uVar21 + ((ulong)pUVar39 & 0xffffffff),pBVar2);
        uVar21 = sVar19 + uVar21;
        if (pBVar30 < uVar21) {
          iVar14 = (U32)uVar21 + uVar11;
          if (uVar21 <= iVar17 - uVar11) {
            iVar14 = iVar17;
          }
          pZVar7[uVar33].off = (uVar37 + 2) - uVar11;
          pZVar7[uVar33].len = (U32)uVar21;
          uVar40 = uVar40 + 1;
          uVar33 = (ulong)uVar40;
          if ((0x1000 < uVar21) ||
             (pBVar30 = (BYTE *)uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2)) break;
        }
        uVar40 = (uint)uVar33;
        puVar41 = pUVar8 + (uVar11 & uVar13) * 2;
        if (pBVar31[uVar21 + ((ulong)pUVar39 & 0xffffffff)] < *(byte *)((long)local_1b8 + uVar21)) {
          *local_1c0 = uVar11;
          if (uVar11 <= uVar36) goto LAB_001eced8;
          puVar41 = puVar41 + 1;
          uVar42 = uVar21;
          uVar21 = uVar44;
          local_1c0 = puVar41;
        }
        else {
          *local_200 = uVar11;
          local_200 = puVar41;
          if (uVar11 <= uVar36) goto LAB_001eceec;
        }
        pUVar39 = (U32 *)(ulong)*puVar41;
        uVar44 = uVar21;
        iVar17 = iVar14;
      }
      goto LAB_001ed0a2;
    }
    bVar46 = (U32)local_158 == 0;
    uVar42 = (ulong)bVar46;
    uVar11 = (ms->cParams).targetLength;
    if (0xffe < uVar11) {
      uVar11 = 0xfff;
    }
    pBVar31 = (ms->window).base;
    uVar37 = iVar26 - (int)pBVar31;
    uVar33 = 0;
    local_140 = (uint *)(ulong)(*local_1b8 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
    uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar36 = uVar37 - uVar13;
    if (uVar37 < uVar13) {
      uVar36 = 0;
    }
    uVar40 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    UVar15 = (ms->window).lowLimit;
    UVar12 = uVar37 - uVar40;
    if (uVar37 - UVar15 <= uVar40) {
      UVar12 = UVar15;
    }
    pUVar8 = ms->chainTable;
    if (ms->loadedDictEnd != 0) {
      UVar12 = UVar15;
    }
    uVar38 = UVar12 + (UVar12 == 0);
    uVar44 = (ulong)((uVar13 & uVar37) * 2);
    local_1f0 = pUVar8 + uVar44;
    local_1f8 = pUVar8 + uVar44 + 1;
    UVar15 = (ms->window).dictLimit;
    iVar34 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    local_170 = ms->hashTable;
    local_168 = (uint *)(ulong)local_170[(long)local_140];
    iVar14 = uVar37 + 9;
    uVar44 = uVar42 + 3;
    local_e8 = (U32 *)CONCAT44(local_e8._4_4_,UVar12);
    pBVar30 = local_b8;
    for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
      if (uVar42 == 3) {
        uVar40 = (*local_d8)[0] - 1;
      }
      else {
        uVar40 = (*local_d8)[uVar42];
      }
      uVar43 = 0;
      if (((uVar40 - 1 < uVar37 - UVar15) && (uVar43 = 0, UVar12 <= uVar37 - uVar40)) &&
         (((*(uint *)((long)local_1b8 - (ulong)uVar40) ^ *local_1b8) & 0xffffff) == 0)) {
        sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + 3),
                            (BYTE *)((long)local_1b8 + 3) + -(ulong)uVar40,pBVar2);
        uVar43 = (int)sVar19 + 3;
        UVar12 = (uint)local_e8;
      }
      uVar21 = (ulong)uVar43;
      if (pBVar30 < uVar21) {
        pZVar7[uVar33].off = (int)uVar42 - (uint)bVar46;
        pZVar7[uVar33].len = uVar43;
        uVar40 = (int)uVar33 + 1;
        uVar33 = (ulong)uVar40;
        puVar41 = local_e0;
        if ((uVar11 < uVar43) ||
           (pBVar30 = (BYTE *)uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2))
        goto LAB_001ed0c0;
      }
    }
    if (((2 < pBVar30) ||
        (UVar15 = ZSTD_insertAndFindFirstIndexHash3(ms,&nextToUpdate3_1,(BYTE *)local_1b8),
        UVar15 < uVar38)) ||
       ((0x3ffff < uVar37 - UVar15 ||
        (sVar19 = ZSTD_count((BYTE *)local_1b8,pBVar31 + UVar15,pBVar2), sVar19 < 3)))) {
LAB_001ecf0b:
      local_170[(long)local_140] = uVar37;
      uVar42 = 0;
      puVar41 = local_168;
      uVar44 = 0;
      do {
        uVar40 = (uint)uVar33;
        bVar46 = iVar34 == 0;
        iVar34 = iVar34 + -1;
        local_200 = local_1f8;
        if ((bVar46) || (uVar11 = (uint)puVar41, uVar11 < uVar38)) goto LAB_001ed0a2;
        uVar21 = uVar44;
        if (uVar42 < uVar44) {
          uVar21 = uVar42;
        }
        sVar19 = ZSTD_count((BYTE *)((long)local_1b8 + uVar21),
                            pBVar31 + uVar21 + ((ulong)puVar41 & 0xffffffff),pBVar2);
        uVar21 = sVar19 + uVar21;
        if (pBVar30 < uVar21) {
          iVar17 = uVar11 + (U32)uVar21;
          if (uVar21 <= iVar14 - uVar11) {
            iVar17 = iVar14;
          }
          iVar14 = iVar17;
          pZVar7[uVar33].off = (uVar37 + 2) - uVar11;
          pZVar7[uVar33].len = (U32)uVar21;
          uVar40 = uVar40 + 1;
          uVar33 = (ulong)uVar40;
          if ((0x1000 < uVar21) ||
             (pBVar30 = (BYTE *)uVar21, (BYTE *)((long)local_1b8 + uVar21) == pBVar2))
          goto LAB_001ed0a2;
        }
        uVar40 = (uint)uVar33;
        puVar35 = pUVar8 + (uVar11 & uVar13) * 2;
        if (pBVar31[uVar21 + ((ulong)puVar41 & 0xffffffff)] < *(byte *)((long)local_1b8 + uVar21)) {
          *local_1f0 = uVar11;
          if (uVar11 <= uVar36) {
            local_1f0 = local_138;
            goto LAB_001ed0a2;
          }
          puVar35 = puVar35 + 1;
          uVar42 = uVar21;
          uVar21 = uVar44;
          local_1f0 = puVar35;
        }
        else {
          *local_1f8 = uVar11;
          local_1f8 = puVar35;
          if (uVar11 <= uVar36) {
            local_200 = local_138;
            goto LAB_001ed0a2;
          }
        }
        puVar41 = (uint *)(ulong)*puVar35;
        uVar44 = uVar21;
      } while( true );
    }
    pZVar7->off = (uVar37 - UVar15) + 2;
    pZVar7->len = (U32)sVar19;
    uVar33 = 1;
    uVar40 = 1;
    pBVar30 = (BYTE *)sVar19;
    if (sVar19 <= uVar11 && (BYTE *)(sVar19 + (long)local_1b8) != pBVar2) goto LAB_001ecf0b;
    UVar15 = uVar37 + 1;
    goto LAB_001ed0ab;
  }
  goto LAB_001ed0c0;
LAB_001ea209:
  local_1f0 = &nextToUpdate3_1;
  goto LAB_001ea3fc;
LAB_001ea38a:
  local_200 = &nextToUpdate3_1;
LAB_001ea3fc:
  *local_200 = 0;
  *local_1f0 = 0;
  UVar15 = iVar14 - 8;
LAB_001ea405:
  ms->nextToUpdate = UVar15;
  puVar41 = local_e0;
LAB_001ea41d:
  nbMatches = uVar40;
  ZSTD_optLdm_processMatchCandidate
            (&local_68,pZVar7,&nbMatches,iVar26 - (int)puVar41,(int)pBVar2 - iVar26);
  UVar15 = nbMatches;
  poVar45 = local_f0;
  uVar42 = (ulong)nbMatches;
  if (uVar42 != 0) goto LAB_001ea475;
  local_1b8 = (uint *)((long)local_1b8 + 1);
  goto LAB_001e936b;
LAB_001ea475:
  for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
    pZVar5->rep[lVar22] = local_138[lVar22];
  }
  pZVar5->mlen = 0;
  pZVar5->litlen = (U32)local_158;
  UVar12 = ZSTD_litLengthPrice((U32)local_158,local_f0,2);
  pZVar5->price = UVar12;
  uVar40 = pZVar7[UVar15 - 1].len;
  if ((uint)local_c8 < uVar40) {
    UVar16 = pZVar7[UVar15 - 1].off;
    uVar42 = 0;
    UVar15 = (U32)local_158;
  }
  else {
    UVar15 = ZSTD_litLengthPrice(0,poVar45,2);
    pZVar28 = local_98;
    for (puVar41 = (uint *)0x1; puVar41 < local_140; puVar41 = (uint *)((long)puVar41 + 1)) {
      pZVar28->price = 0x40000000;
      pZVar28 = pZVar28 + 1;
    }
    for (uVar33 = 0; uVar33 != uVar42; uVar33 = uVar33 + 1) {
      UVar16 = pZVar7[uVar33].off;
      uVar11 = pZVar7[uVar33].len;
      uVar40 = UVar16 + 1;
      uVar36 = 0x1f;
      if (uVar40 != 0) {
        for (; uVar40 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar40 = (int)puVar41 * 0x100 - 0x200;
      while (uVar37 = (uint)puVar41, uVar37 <= uVar11) {
        if ((ms->opt).priceType == zop_predef) {
          iVar26 = 0x1f;
          if (uVar37 - 2 != 0) {
            for (; uVar37 - 2 >> iVar26 == 0; iVar26 = iVar26 + -1) {
            }
          }
          iVar26 = (iVar26 + uVar36) * 0x100 + (uVar40 >> ((byte)iVar26 & 0x1f)) + 0x1000;
        }
        else {
          uVar13 = uVar37 - 3;
          uVar38 = (ms->opt).offCodeFreq[uVar36] + 1;
          iVar26 = 0x1f;
          if (uVar38 != 0) {
            for (; uVar38 >> iVar26 == 0; iVar26 = iVar26 + -1) {
            }
          }
          if (uVar13 < 0x80) {
            uVar13 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar13];
          }
          else {
            uVar43 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar43 == 0; uVar43 = uVar43 - 1) {
              }
            }
            uVar13 = (uVar43 ^ 0xffffffe0) + 0x44;
          }
          uVar43 = (ms->opt).matchLengthFreq[uVar13] + 1;
          iVar34 = 0x1f;
          if (uVar43 != 0) {
            for (; uVar43 >> iVar34 == 0; iVar34 = iVar34 + -1) {
            }
          }
          iVar26 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar38 * 0x100 >> ((byte)iVar26 & 0x1f)) +
                   (uVar43 * 0x100 >> ((byte)iVar34 & 0x1f)))) +
                   ((ML_bits[uVar13] + uVar36) - (iVar26 + iVar34)) * 0x100 + 0x33;
        }
        uVar44 = (ulong)puVar41 & 0xffffffff;
        pZVar5[uVar44].mlen = uVar37;
        pZVar5[uVar44].off = UVar16;
        pZVar5[uVar44].litlen = (U32)local_158;
        pZVar5[uVar44].price = iVar26 + UVar15 + UVar12;
        uVar40 = uVar40 + 0x100;
        puVar41 = (uint *)(ulong)(uVar37 + 1);
      }
    }
    uVar42 = (ulong)((int)puVar41 - 1);
    uVar33 = 1;
LAB_001ea655:
    poVar45 = local_f0;
    uVar36 = (uint)uVar33;
    uVar11 = (uint)uVar42;
    if (uVar36 <= uVar11) {
      pZVar28 = pZVar5 + (uVar36 - 1);
      UVar15 = 1;
      if (pZVar5[uVar36 - 1].mlen == 0) {
        UVar15 = pZVar28->litlen + 1;
      }
      puVar41 = (uint *)((long)local_1b8 + uVar33);
      local_158 = CONCAT44(local_158._4_4_,pZVar28->price);
      UVar12 = ZSTD_rawLiteralsCost
                         ((BYTE *)((long)puVar41 + -1),(U32)local_f0,(optState_t *)0x2,
                          pZVar28->price);
      UVar16 = ZSTD_litLengthPrice(UVar15,poVar45,2);
      iVar26 = UVar16 + UVar12 + (U32)local_158;
      UVar12 = ZSTD_litLengthPrice(UVar15 - 1,poVar45,2);
      iVar26 = iVar26 - UVar12;
      pZVar3 = pZVar5 + uVar33;
      iVar34 = pZVar5[uVar33].price;
      if (iVar34 < iVar26) {
        iVar26 = iVar34;
        if (pZVar3->mlen == 0) goto LAB_001ea76d;
        rVar47 = ZSTD_updateRep(pZVar5[uVar36 - pZVar3->mlen].rep,pZVar3->off,
                                (uint)(pZVar3->litlen == 0));
        *&pZVar3->rep = rVar47.rep;
        uVar40 = 1;
        bVar46 = false;
      }
      else {
        pZVar3->off = 0;
        pZVar3->mlen = 0;
        pZVar3->litlen = UVar15;
        pZVar3->price = iVar26;
LAB_001ea76d:
        pZVar3->rep[2] = pZVar28->rep[2];
        *(undefined8 *)pZVar3->rep = *(undefined8 *)pZVar28->rep;
        bVar46 = true;
        uVar40 = 0;
      }
      if (local_e8 < puVar41) goto LAB_001eb9b5;
      if (uVar36 != uVar11) {
        UVar15 = 0;
        if (bVar46) {
          UVar15 = pZVar3->litlen;
        }
        UVar12 = ZSTD_litLengthPrice(0,local_f0,2);
        pUVar8 = local_78;
        local_158 = CONCAT44(local_158._4_4_,UVar12);
        pBVar31 = (ms->window).base;
        uVar44 = (ulong)ms->nextToUpdate;
        iVar34 = (int)puVar41;
        if (pBVar31 + uVar44 <= puVar41) {
          UVar12 = (ms->cParams).minMatch;
          uVar11 = iVar34 - (int)pBVar31;
          for (; (uint)uVar44 < uVar11; uVar44 = (ulong)((uint)uVar44 + UVar16)) {
            UVar16 = ZSTD_insertBt1(ms,pBVar31 + uVar44,pBVar2,UVar12,0);
          }
          ms->nextToUpdate = uVar11;
          uVar44 = (ulong)uVar40;
          if (UVar12 - 6 < 2) {
            uVar11 = (ms->cParams).targetLength;
            if (0xffe < uVar11) {
              uVar11 = 0xfff;
            }
            local_148 = (optState_t *)(ms->window).base;
            uVar37 = iVar34 - (int)local_148;
            local_1f8 = (uint *)0x0;
            local_108 = (ulong)(*(long *)puVar41 * -0x30e4432340650000) >>
                        (-(char)(ms->cParams).hashLog & 0x3fU);
            uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar17 = uVar37 - uVar13;
            if (uVar37 < uVar13) {
              iVar17 = 0;
            }
            local_160 = (U32 *)CONCAT44(local_160._4_4_,iVar17);
            uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar12 = (ms->window).lowLimit;
            UVar16 = uVar37 - uVar38;
            if (uVar37 - UVar12 <= uVar38) {
              UVar16 = UVar12;
            }
            local_118 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              UVar16 = UVar12;
            }
            local_150 = (uint *)CONCAT44(local_150._4_4_,UVar16);
            local_168 = (uint *)CONCAT44(local_168._4_4_,UVar16 + (UVar16 == 0));
            local_170 = (U32 *)CONCAT44(local_170._4_4_,uVar13);
            uVar21 = (ulong)((uVar13 & uVar37) * 2);
            local_190 = local_118 + uVar21;
            local_1d0 = local_118 + uVar21 + 1;
            uVar13 = uVar37 - (ms->window).dictLimit;
            iVar14 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            uVar23 = (ulong)-uVar40;
            local_110 = ms->hashTable;
            local_100 = (ulong)local_110[local_108];
            iVar17 = uVar37 + 9;
            uVar21 = uVar44 + 3;
            local_128 = puVar41 + 1;
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar13);
            uVar20 = local_c0;
            local_120 = uVar23;
            for (; uVar44 < uVar21; uVar44 = uVar44 + 1) {
              if (uVar44 == 3) {
                uVar40 = pZVar3->rep[0] - 1;
              }
              else {
                uVar40 = pUVar8[uVar33 * 7 + uVar44];
              }
              uVar38 = 0;
              if (((uVar40 - 1 < uVar13) && (uVar38 = 0, (uint)local_150 <= uVar37 - uVar40)) &&
                 (*puVar41 == *(uint *)((long)puVar41 - (ulong)uVar40))) {
                sVar19 = ZSTD_count((BYTE *)local_128,(BYTE *)((long)local_128 - (ulong)uVar40),
                                    pBVar2);
                uVar38 = (int)sVar19 + 4;
                uVar23 = local_120;
                uVar13 = (uint)local_f8;
              }
              uVar29 = (ulong)uVar38;
              if (uVar20 < uVar29) {
                pZVar7[(long)local_1f8].off = (int)uVar23 + (int)uVar44;
                pZVar7[(long)local_1f8].len = uVar38;
                uVar40 = (int)local_1f8 + 1;
                local_1f8 = (uint *)(ulong)uVar40;
                if ((uVar11 < uVar38) ||
                   (uVar20 = uVar29, (BYTE *)((long)puVar41 + uVar29) == pBVar2)) goto LAB_001eb7ac;
              }
            }
            local_110[local_108] = uVar37;
            uVar33 = 0;
            uVar44 = 0;
            uVar21 = local_100;
            while( true ) {
              poVar45 = local_148;
              uVar40 = (uint)local_1f8;
              bVar46 = iVar14 == 0;
              iVar14 = iVar14 + -1;
              iVar27 = iVar17;
              if (bVar46) break;
              uVar11 = (uint)uVar21;
              if (uVar11 < (uint)local_168) break;
              uVar23 = uVar33;
              if (uVar44 < uVar33) {
                uVar23 = uVar44;
              }
              sVar19 = ZSTD_count((BYTE *)((long)puVar41 + uVar23),
                                  (BYTE *)((long)local_148 + uVar23 + (uVar21 & 0xffffffff)),pBVar2)
              ;
              uVar23 = sVar19 + uVar23;
              if (uVar20 < uVar23) {
                iVar27 = uVar11 + (U32)uVar23;
                if (uVar23 <= iVar17 - uVar11) {
                  iVar27 = iVar17;
                }
                pZVar7[(long)local_1f8].off = (uVar37 + 2) - uVar11;
                pZVar7[(long)local_1f8].len = (U32)uVar23;
                uVar40 = uVar40 + 1;
                local_1f8 = (uint *)(ulong)uVar40;
                if ((0x1000 < uVar23) ||
                   (uVar20 = uVar23, iVar17 = iVar27, (BYTE *)((long)puVar41 + uVar23) == pBVar2))
                break;
              }
              puVar35 = local_118 + (uVar11 & (uint)local_170) * 2;
              iVar27 = iVar17;
              uVar40 = (uint)local_1f8;
              if (*(byte *)((long)poVar45 + uVar23 + (uVar21 & 0xffffffff)) <
                  *(byte *)((long)puVar41 + uVar23)) {
                *local_190 = uVar11;
                if (uVar11 <= (uint)local_160) {
                  local_190 = &nextToUpdate3_1;
                  break;
                }
                puVar35 = puVar35 + 1;
                uVar44 = uVar23;
                local_190 = puVar35;
              }
              else {
                *local_1d0 = uVar11;
                local_1d0 = puVar35;
                uVar33 = uVar23;
                if (uVar11 <= (uint)local_160) {
                  local_1d0 = &nextToUpdate3_1;
                  break;
                }
              }
              uVar21 = (ulong)*puVar35;
            }
            *local_1d0 = 0;
            goto LAB_001eb7a1;
          }
          if (UVar12 == 5) {
            uVar11 = (ms->cParams).targetLength;
            if (0xffe < uVar11) {
              uVar11 = 0xfff;
            }
            local_168 = (uint *)(ms->window).base;
            uVar37 = iVar34 - (int)local_168;
            local_1f8 = (uint *)0x0;
            local_108 = (ulong)(*(long *)puVar41 * -0x30e4432345000000) >>
                        (-(char)(ms->cParams).hashLog & 0x3fU);
            uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar17 = uVar37 - uVar13;
            if (uVar37 < uVar13) {
              iVar17 = 0;
            }
            local_170 = (U32 *)CONCAT44(local_170._4_4_,iVar17);
            uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar38 = (ms->window).lowLimit;
            uVar43 = uVar37 - uVar32;
            if (uVar37 - uVar38 <= uVar32) {
              uVar43 = uVar38;
            }
            local_160 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              uVar43 = uVar38;
            }
            local_148 = (optState_t *)CONCAT44(local_148._4_4_,uVar13);
            uVar21 = (ulong)((uVar13 & uVar37) * 2);
            local_150 = local_160 + uVar21;
            local_1f0 = local_160 + uVar21 + 1;
            uVar13 = uVar37 - (ms->window).dictLimit;
            iVar14 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            pUVar39 = (U32 *)(ulong)-uVar40;
            local_110 = ms->hashTable;
            local_100 = (ulong)local_110[local_108];
            iVar17 = uVar37 + 9;
            uVar21 = uVar44 + 3;
            local_128 = puVar41 + 1;
            local_118 = (U32 *)CONCAT44(local_118._4_4_,uVar13);
            uVar20 = local_c0;
            local_120 = uVar21;
            local_f8 = pUVar39;
            for (; uVar44 < uVar21; uVar44 = uVar44 + 1) {
              if (uVar44 == 3) {
                uVar40 = pZVar3->rep[0] - 1;
              }
              else {
                uVar40 = pUVar8[uVar33 * 7 + uVar44];
              }
              uVar38 = 0;
              if (((uVar40 - 1 < uVar13) && (uVar38 = 0, uVar43 <= uVar37 - uVar40)) &&
                 (*puVar41 == *(uint *)((long)puVar41 - (ulong)uVar40))) {
                sVar19 = ZSTD_count((BYTE *)local_128,(BYTE *)((long)local_128 - (ulong)uVar40),
                                    pBVar2);
                uVar38 = (int)sVar19 + 4;
                uVar21 = local_120;
                pUVar39 = local_f8;
                uVar13 = (uint)local_118;
              }
              uVar23 = (ulong)uVar38;
              if (uVar20 < uVar23) {
                pZVar7[(long)local_1f8].off = (int)pUVar39 + (int)uVar44;
                pZVar7[(long)local_1f8].len = uVar38;
                uVar40 = (int)local_1f8 + 1;
                local_1f8 = (uint *)(ulong)uVar40;
                if ((uVar11 < uVar38) ||
                   (uVar20 = uVar23, (BYTE *)((long)puVar41 + uVar23) == pBVar2)) goto LAB_001eb7ac;
              }
            }
            local_110[local_108] = uVar37;
            uVar33 = 0;
            uVar44 = 0;
            uVar21 = local_100;
            while( true ) {
              puVar35 = local_168;
              uVar40 = (uint)local_1f8;
              bVar46 = iVar14 == 0;
              iVar14 = iVar14 + -1;
              iVar27 = iVar17;
              if ((bVar46) || (uVar11 = (uint)uVar21, uVar11 < uVar43 + (uVar43 == 0))) break;
              uVar23 = uVar33;
              if (uVar44 < uVar33) {
                uVar23 = uVar44;
              }
              sVar19 = ZSTD_count((BYTE *)((long)puVar41 + uVar23),
                                  (BYTE *)((long)local_168 + uVar23 + (uVar21 & 0xffffffff)),pBVar2)
              ;
              uVar23 = sVar19 + uVar23;
              if (uVar20 < uVar23) {
                iVar27 = uVar11 + (U32)uVar23;
                if (uVar23 <= iVar17 - uVar11) {
                  iVar27 = iVar17;
                }
                pZVar7[(long)local_1f8].off = (uVar37 + 2) - uVar11;
                pZVar7[(long)local_1f8].len = (U32)uVar23;
                uVar40 = uVar40 + 1;
                local_1f8 = (uint *)(ulong)uVar40;
                if ((0x1000 < uVar23) ||
                   (uVar20 = uVar23, iVar17 = iVar27, (BYTE *)((long)puVar41 + uVar23) == pBVar2))
                break;
              }
              puVar24 = local_160 + (uVar11 & (uint)local_148) * 2;
              uVar40 = (uint)local_1f8;
              if (*(byte *)((long)puVar35 + uVar23 + (uVar21 & 0xffffffff)) <
                  *(byte *)((long)puVar41 + uVar23)) {
                *local_150 = uVar11;
                if (uVar11 <= (uint)local_170) goto LAB_001eb772;
                puVar24 = puVar24 + 1;
                uVar44 = uVar23;
                local_150 = puVar24;
              }
              else {
                *local_1f0 = uVar11;
                local_1f0 = puVar24;
                uVar33 = uVar23;
                if (uVar11 <= (uint)local_170) goto LAB_001eb784;
              }
              uVar21 = (ulong)*puVar24;
            }
            goto LAB_001eb791;
          }
          if (UVar12 != 3) {
            uVar11 = (ms->cParams).targetLength;
            if (0xffe < uVar11) {
              uVar11 = 0xfff;
            }
            local_168 = (uint *)(ms->window).base;
            uVar37 = iVar34 - (int)local_168;
            local_1f8 = (uint *)0x0;
            local_108 = (ulong)(*puVar41 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar17 = uVar37 - uVar13;
            if (uVar37 < uVar13) {
              iVar17 = 0;
            }
            local_170 = (U32 *)CONCAT44(local_170._4_4_,iVar17);
            uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar38 = (ms->window).lowLimit;
            uVar43 = uVar37 - uVar32;
            if (uVar37 - uVar38 <= uVar32) {
              uVar43 = uVar38;
            }
            local_160 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              uVar43 = uVar38;
            }
            local_148 = (optState_t *)CONCAT44(local_148._4_4_,uVar13);
            uVar21 = (ulong)((uVar13 & uVar37) * 2);
            local_150 = local_160 + uVar21;
            local_1f0 = local_160 + uVar21 + 1;
            uVar13 = uVar37 - (ms->window).dictLimit;
            iVar14 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            pUVar39 = (U32 *)(ulong)-uVar40;
            local_110 = ms->hashTable;
            local_100 = (ulong)local_110[local_108];
            iVar17 = uVar37 + 9;
            uVar21 = uVar44 + 3;
            local_128 = puVar41 + 1;
            local_118 = (U32 *)CONCAT44(local_118._4_4_,uVar13);
            uVar20 = local_c0;
            local_120 = uVar21;
            local_f8 = pUVar39;
            for (; uVar44 < uVar21; uVar44 = uVar44 + 1) {
              if (uVar44 == 3) {
                uVar40 = pZVar3->rep[0] - 1;
              }
              else {
                uVar40 = pUVar8[uVar33 * 7 + uVar44];
              }
              uVar38 = 0;
              if (((uVar40 - 1 < uVar13) && (uVar38 = 0, uVar43 <= uVar37 - uVar40)) &&
                 (*puVar41 == *(uint *)((long)puVar41 - (ulong)uVar40))) {
                sVar19 = ZSTD_count((BYTE *)local_128,(BYTE *)((long)local_128 - (ulong)uVar40),
                                    pBVar2);
                uVar38 = (int)sVar19 + 4;
                uVar21 = local_120;
                pUVar39 = local_f8;
                uVar13 = (uint)local_118;
              }
              uVar23 = (ulong)uVar38;
              if (uVar20 < uVar23) {
                pZVar7[(long)local_1f8].off = (int)pUVar39 + (int)uVar44;
                pZVar7[(long)local_1f8].len = uVar38;
                uVar40 = (int)local_1f8 + 1;
                local_1f8 = (uint *)(ulong)uVar40;
                if ((uVar11 < uVar38) ||
                   (uVar20 = uVar23, (BYTE *)((long)puVar41 + uVar23) == pBVar2)) goto LAB_001eb7ac;
              }
            }
            local_110[local_108] = uVar37;
            uVar33 = 0;
            uVar44 = 0;
            uVar21 = local_100;
            while( true ) {
              puVar35 = local_168;
              uVar40 = (uint)local_1f8;
              bVar46 = iVar14 == 0;
              iVar14 = iVar14 + -1;
              iVar27 = iVar17;
              if ((bVar46) || (uVar11 = (uint)uVar21, uVar11 < uVar43 + (uVar43 == 0))) break;
              uVar23 = uVar33;
              if (uVar44 < uVar33) {
                uVar23 = uVar44;
              }
              sVar19 = ZSTD_count((BYTE *)((long)puVar41 + uVar23),
                                  (BYTE *)((long)local_168 + uVar23 + (uVar21 & 0xffffffff)),pBVar2)
              ;
              uVar23 = sVar19 + uVar23;
              if (uVar20 < uVar23) {
                iVar27 = uVar11 + (U32)uVar23;
                if (uVar23 <= iVar17 - uVar11) {
                  iVar27 = iVar17;
                }
                pZVar7[(long)local_1f8].off = (uVar37 + 2) - uVar11;
                pZVar7[(long)local_1f8].len = (U32)uVar23;
                uVar40 = uVar40 + 1;
                local_1f8 = (uint *)(ulong)uVar40;
                if ((0x1000 < uVar23) ||
                   (uVar20 = uVar23, iVar17 = iVar27, (BYTE *)((long)puVar41 + uVar23) == pBVar2))
                break;
              }
              puVar24 = local_160 + (uVar11 & (uint)local_148) * 2;
              uVar40 = (uint)local_1f8;
              if (*(byte *)((long)puVar35 + uVar23 + (uVar21 & 0xffffffff)) <
                  *(byte *)((long)puVar41 + uVar23)) {
                *local_150 = uVar11;
                if (uVar11 <= (uint)local_170) goto LAB_001eb772;
                puVar24 = puVar24 + 1;
                uVar44 = uVar23;
                local_150 = puVar24;
              }
              else {
                *local_1f0 = uVar11;
                local_1f0 = puVar24;
                uVar33 = uVar23;
                if (uVar11 <= (uint)local_170) goto LAB_001eb784;
              }
              uVar21 = (ulong)*puVar24;
            }
            goto LAB_001eb791;
          }
          uVar11 = (ms->cParams).targetLength;
          if (0xffe < uVar11) {
            uVar11 = 0xfff;
          }
          local_168 = (uint *)(ms->window).base;
          uVar37 = iVar34 - (int)local_168;
          local_1f8 = (uint *)0x0;
          local_108 = (ulong)(*puVar41 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
          uVar13 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar17 = uVar37 - uVar13;
          if (uVar37 < uVar13) {
            iVar17 = 0;
          }
          local_170 = (U32 *)CONCAT44(local_170._4_4_,iVar17);
          uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar38 = (ms->window).lowLimit;
          uVar43 = uVar37 - uVar32;
          if (uVar37 - uVar38 <= uVar32) {
            uVar43 = uVar38;
          }
          local_160 = ms->chainTable;
          if (ms->loadedDictEnd != 0) {
            uVar43 = uVar38;
          }
          uVar38 = uVar43 + (uVar43 == 0);
          local_148 = (optState_t *)CONCAT44(local_148._4_4_,uVar13);
          uVar21 = (ulong)((uVar13 & uVar37) * 2);
          local_150 = local_160 + uVar21;
          local_1f0 = local_160 + uVar21 + 1;
          uVar13 = uVar37 - (ms->window).dictLimit;
          iVar14 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          uVar23 = (ulong)-uVar40;
          local_110 = ms->hashTable;
          local_100 = (ulong)local_110[local_108];
          iVar17 = uVar37 + 9;
          uVar21 = uVar44 + 3;
          local_128 = (uint *)((long)puVar41 + 3);
          local_118 = (U32 *)CONCAT44(local_118._4_4_,uVar11);
          local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar13);
          uVar20 = local_c0;
          local_120 = uVar23;
          for (; uVar44 < uVar21; uVar44 = uVar44 + 1) {
            if (uVar44 == 3) {
              uVar40 = pZVar3->rep[0] - 1;
            }
            else {
              uVar40 = pUVar8[uVar33 * 7 + uVar44];
            }
            uVar32 = 0;
            if (((uVar40 - 1 < uVar13) && (uVar32 = 0, uVar43 <= uVar37 - uVar40)) &&
               (((*(uint *)((long)puVar41 - (ulong)uVar40) ^ *puVar41) & 0xffffff) == 0)) {
              sVar19 = ZSTD_count((BYTE *)local_128,(BYTE *)((long)local_128 - (ulong)uVar40),pBVar2
                                 );
              uVar32 = (int)sVar19 + 3;
              uVar23 = local_120;
              uVar13 = (uint)local_f8;
              uVar11 = (uint)local_118;
            }
            uVar29 = (ulong)uVar32;
            if (uVar20 < uVar29) {
              pZVar7[(long)local_1f8].off = (int)uVar23 + (int)uVar44;
              pZVar7[(long)local_1f8].len = uVar32;
              uVar40 = (int)local_1f8 + 1;
              local_1f8 = (uint *)(ulong)uVar40;
              if ((uVar11 < uVar32) || (uVar20 = uVar29, (BYTE *)((long)puVar41 + uVar29) == pBVar2)
                 ) goto LAB_001eb7ac;
            }
          }
          if (((uVar20 < 3) &&
              (UVar12 = ZSTD_insertAndFindFirstIndexHash3(ms,&nextToUpdate3,(BYTE *)puVar41),
              uVar38 <= UVar12)) &&
             ((uVar37 - UVar12 < 0x40000 &&
              (sVar19 = ZSTD_count((BYTE *)puVar41,(BYTE *)((ulong)UVar12 + (long)local_168),pBVar2)
              , 2 < sVar19)))) {
            pZVar7->off = (uVar37 - UVar12) + 2;
            pZVar7->len = (U32)sVar19;
            local_1f8 = (uint *)0x1;
            uVar20 = sVar19;
            if (sVar19 <= ((ulong)local_118 & 0xffffffff) &&
                (BYTE *)(sVar19 + (long)puVar41) != pBVar2) goto LAB_001eb9c0;
            UVar12 = uVar37 + 1;
            uVar40 = 1;
          }
          else {
LAB_001eb9c0:
            local_110[local_108] = uVar37;
            uVar44 = 0;
            uVar21 = 0;
            uVar33 = local_100;
LAB_001eb9ec:
            puVar35 = local_168;
            bVar46 = iVar14 == 0;
            iVar14 = iVar14 + -1;
            uVar40 = (uint)local_1f8;
            if ((bVar46) || (uVar11 = (uint)uVar33, uVar11 < uVar38)) goto LAB_001ebb72;
            uVar23 = uVar44;
            if (uVar21 < uVar44) {
              uVar23 = uVar21;
            }
            sVar19 = ZSTD_count((BYTE *)((long)puVar41 + uVar23),
                                (BYTE *)((long)local_168 + uVar23 + (uVar33 & 0xffffffff)),pBVar2);
            uVar23 = sVar19 + uVar23;
            if (uVar20 < uVar23) {
              iVar27 = uVar11 + (U32)uVar23;
              if (uVar23 <= iVar17 - uVar11) {
                iVar27 = iVar17;
              }
              pZVar7[(long)local_1f8].off = (uVar37 + 2) - uVar11;
              pZVar7[(long)local_1f8].len = (U32)uVar23;
              uVar40 = (uint)local_1f8 + 1;
              local_1f8 = (uint *)(ulong)uVar40;
              iVar17 = iVar27;
              if ((0x1000 < uVar23) || (uVar20 = uVar23, (BYTE *)((long)puVar41 + uVar23) == pBVar2)
                 ) goto LAB_001ebb72;
            }
            puVar24 = local_160 + (uVar11 & (uint)local_148) * 2;
            uVar40 = (uint)local_1f8;
            if (*(byte *)((long)puVar41 + uVar23) <=
                *(byte *)((long)puVar35 + uVar23 + (uVar33 & 0xffffffff))) {
              *local_1f0 = uVar11;
              local_1f0 = puVar24;
              uVar44 = uVar23;
              if (uVar11 <= (uint)local_170) {
                local_1f0 = &nextToUpdate3_1;
                goto LAB_001ebb72;
              }
LAB_001ebb3d:
              uVar33 = (ulong)*puVar24;
              goto LAB_001eb9ec;
            }
            *local_150 = uVar11;
            if ((uint)local_170 < uVar11) {
              puVar24 = puVar24 + 1;
              uVar21 = uVar23;
              local_150 = puVar24;
              goto LAB_001ebb3d;
            }
            local_150 = &nextToUpdate3_1;
LAB_001ebb72:
            local_1f8._0_4_ = uVar40;
            *local_1f0 = 0;
            *local_150 = 0;
            UVar12 = iVar17 - 8;
            uVar40 = (uint)local_1f8;
          }
          goto LAB_001eb7a7;
        }
        uVar40 = 0;
        goto LAB_001eb7ac;
      }
    }
    uVar42 = uVar42 & 0xffffffff;
    local_ac = pZVar5[uVar42].price;
    UVar16 = pZVar5[uVar42].off;
    uVar40 = pZVar5[uVar42].mlen;
    UVar15 = pZVar5[uVar42].litlen;
    local_88 = pZVar5[uVar42].rep[2];
    local_90 = *(undefined8 *)pZVar5[uVar42].rep;
    uVar42 = (ulong)(uVar11 - (UVar15 + uVar40));
    if (uVar11 < UVar15 + uVar40) {
      uVar42 = 0;
    }
LAB_001ebbdd:
    if (uVar40 == 0) {
      local_138[2] = pZVar5[uVar42].rep[2];
      local_138._0_8_ = *(undefined8 *)pZVar5[uVar42].rep;
      uVar40 = 0;
      goto LAB_001ebc15;
    }
  }
  local_138 = (U32  [3])ZSTD_updateRep(pZVar5[uVar42].rep,UVar16,(uint)(UVar15 == 0));
LAB_001ebc15:
  local_158 = (ulong)((int)uVar42 + 1);
  pZVar5[local_158].price = local_ac;
  pZVar5[local_158].off = UVar16;
  pZVar5[local_158].mlen = uVar40;
  pZVar5[local_158].litlen = UVar15;
  *(undefined8 *)pZVar5[local_158].rep = local_90;
  pZVar5[local_158].rep[2] = local_88;
  uVar33 = uVar42;
  while( true ) {
    uVar11 = (uint)uVar42;
    uVar40 = (uint)uVar33;
    src = local_70;
    poVar45 = local_f0;
    if (uVar11 == 0) break;
    uVar36 = pZVar5[uVar42].litlen + pZVar5[uVar42].mlen;
    pZVar28 = pZVar5 + uVar42;
    iVar26 = pZVar28->price;
    UVar12 = pZVar28->off;
    UVar16 = pZVar28->mlen;
    UVar10 = pZVar28->litlen;
    pZVar28 = pZVar5 + uVar42;
    UVar15 = pZVar28->rep[0];
    uVar9 = *(undefined8 *)(&pZVar28->litlen + 2);
    pZVar3 = pZVar5 + uVar33;
    pZVar3->litlen = pZVar28->litlen;
    pZVar3->rep[0] = UVar15;
    *(undefined8 *)(&pZVar3->litlen + 2) = uVar9;
    pZVar28 = pZVar5 + uVar33;
    pZVar28->price = iVar26;
    pZVar28->off = UVar12;
    pZVar28->mlen = UVar16;
    pZVar28->litlen = UVar10;
    uVar42 = (ulong)(uVar11 - uVar36);
    if (uVar11 < uVar36) {
      uVar42 = 0;
    }
    uVar33 = (ulong)(uVar40 - 1);
  }
  while( true ) {
    uVar40 = uVar40 + 1;
    if ((U32)local_158 < uVar40) break;
    UVar15 = pZVar5[uVar40].mlen;
    uVar11 = pZVar5[uVar40].litlen;
    uVar42 = (ulong)uVar11;
    if (UVar15 == 0) {
      local_1b8 = (uint *)(uVar42 + (long)src);
    }
    else {
      UVar12 = pZVar5[uVar40].off;
      ZSTD_updateStats(poVar45,uVar11,(BYTE *)src,UVar12,UVar15);
      pBVar31 = local_a8->lit;
      if (local_b8 < (BYTE *)((long)src + uVar42)) {
        ZSTD_safecopyLiterals(pBVar31,(BYTE *)src,(BYTE *)((long)src + uVar42),local_b8);
LAB_001ebd21:
        local_a8->lit = local_a8->lit + uVar42;
        psVar25 = local_a8->sequences;
        if (0xffff < uVar11) {
          local_a8->longLengthType = ZSTD_llt_literalLength;
          local_a8->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)local_a8->sequencesStart) >> 3);
        }
      }
      else {
        uVar9 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar31 = *src;
        *(undefined8 *)(pBVar31 + 8) = uVar9;
        if (0x10 < uVar11) {
          pBVar31 = local_a8->lit;
          uVar9 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar31 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar31 + 0x18) = uVar9;
          if (0x10 < uVar42 - 0x10) {
            lVar22 = 0;
            do {
              puVar4 = (undefined8 *)((long)src + lVar22 + 0x20);
              uVar9 = puVar4[1];
              pBVar30 = pBVar31 + lVar22 + 0x20;
              *(undefined8 *)pBVar30 = *puVar4;
              *(undefined8 *)(pBVar30 + 8) = uVar9;
              puVar4 = (undefined8 *)((long)src + lVar22 + 0x30);
              uVar9 = puVar4[1];
              *(undefined8 *)(pBVar30 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar30 + 0x18) = uVar9;
              lVar22 = lVar22 + 0x20;
            } while (pBVar30 + 0x20 < pBVar31 + uVar42);
            goto LAB_001ebd21;
          }
        }
        local_a8->lit = local_a8->lit + uVar42;
        psVar25 = local_a8->sequences;
      }
      psVar25->litLength = (U16)uVar11;
      psVar25->offset = UVar12 + 1;
      if (0xffff < UVar15 - 3) {
        local_a8->longLengthType = ZSTD_llt_matchLength;
        local_a8->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)local_a8->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(UVar15 - 3);
      local_a8->sequences = psVar25 + 1;
      src = (void *)((long)src + (ulong)(UVar15 + uVar11));
      poVar45 = local_f0;
      local_1b8 = (uint *)src;
    }
  }
  ZSTD_setBasePrices(poVar45,2);
  puVar41 = local_e0;
  goto LAB_001e9358;
LAB_001eb784:
  local_1f0 = &nextToUpdate3_1;
  iVar27 = iVar17;
  goto LAB_001eb791;
LAB_001eb772:
  local_150 = &nextToUpdate3_1;
  iVar27 = iVar17;
LAB_001eb791:
  *local_1f0 = 0;
  local_190 = local_150;
LAB_001eb7a1:
  *local_190 = 0;
  UVar12 = iVar27 - 8;
LAB_001eb7a7:
  ms->nextToUpdate = UVar12;
LAB_001eb7ac:
  nbMatches = uVar40;
  ZSTD_optLdm_processMatchCandidate
            (&local_68,pZVar7,&nbMatches,iVar34 - (int)local_e0,(int)pBVar2 - iVar34);
  if ((ulong)nbMatches != 0) {
    uVar40 = pZVar7[nbMatches - 1].len;
    if (((uint)local_c8 < uVar40) || (0xfff < uVar40 + uVar36)) {
      UVar12 = 0;
      if (pZVar3->mlen == 0) {
        UVar12 = pZVar3->litlen;
      }
      UVar16 = pZVar7[nbMatches - 1].off;
      uVar42 = (ulong)(uVar36 - UVar12);
      if (0x1000 < uVar36 - UVar12) {
        uVar42 = 0;
      }
      goto LAB_001ebbdd;
    }
    iVar26 = (U32)local_158 + iVar26;
    local_158 = CONCAT44(local_158._4_4_,iVar26);
    for (uVar33 = 0; uVar33 != nbMatches; uVar33 = uVar33 + 1) {
      uVar40 = (uint)local_a0;
      if (uVar33 != 0) {
        uVar40 = pZVar7[uVar33 - 1].len + 1;
      }
      UVar12 = pZVar7[uVar33].off;
      UVar16 = pZVar7[uVar33].len;
      uVar37 = UVar12 + 1;
      uVar11 = 0x1f;
      if (uVar37 != 0) {
        for (; uVar37 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      for (; uVar40 <= UVar16; UVar16 = UVar16 - 1) {
        if ((ms->opt).priceType == zop_predef) {
          uVar37 = UVar16 - 2;
          iVar34 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> iVar34 == 0; iVar34 = iVar34 + -1) {
            }
          }
          iVar34 = (uVar37 * 0x100 >> ((byte)iVar34 & 0x1f)) + (iVar34 + uVar11) * 0x100 + 0x1000;
        }
        else {
          uVar13 = UVar16 - 3;
          uVar37 = (ms->opt).offCodeFreq[uVar11] + 1;
          iVar34 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> iVar34 == 0; iVar34 = iVar34 + -1) {
            }
          }
          if (uVar13 < 0x80) {
            uVar13 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar13];
          }
          else {
            uVar38 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar38 == 0; uVar38 = uVar38 - 1) {
              }
            }
            uVar13 = (uVar38 ^ 0xffffffe0) + 0x44;
          }
          uVar38 = (ms->opt).matchLengthFreq[uVar13] + 1;
          iVar17 = 0x1f;
          if (uVar38 != 0) {
            for (; uVar38 >> iVar17 == 0; iVar17 = iVar17 + -1) {
            }
          }
          iVar34 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar37 * 0x100 >> ((byte)iVar34 & 0x1f)) +
                   (uVar38 * 0x100 >> ((byte)iVar17 & 0x1f)))) +
                   ((ML_bits[uVar13] + uVar11) - (iVar34 + iVar17)) * 0x100 + 0x33;
        }
        iVar34 = iVar34 + iVar26;
        uVar44 = (ulong)(UVar16 + uVar36);
        if (((uint)uVar42 < UVar16 + uVar36) || (iVar34 < pZVar5[uVar44].price)) {
          uVar42 = uVar42 & 0xffffffff;
          pZVar28 = local_98 + uVar42;
          for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
            pZVar28->price = 0x40000000;
            pZVar28 = pZVar28 + 1;
          }
          pZVar5[uVar44].mlen = UVar16;
          pZVar5[uVar44].off = UVar12;
          pZVar5[uVar44].litlen = UVar15;
          pZVar5[uVar44].price = iVar34;
        }
      }
    }
  }
LAB_001eb9b5:
  uVar33 = (ulong)(uVar36 + 1);
  goto LAB_001ea655;
LAB_001eceec:
  local_200 = local_138;
  local_1f0 = local_1c0;
  goto LAB_001ed0a2;
LAB_001eced8:
  local_1f0 = local_138;
LAB_001ed0a2:
  *local_200 = 0;
  *local_1f0 = 0;
  UVar15 = iVar14 - 8;
LAB_001ed0ab:
  ms->nextToUpdate = UVar15;
  puVar41 = local_e0;
LAB_001ed0c0:
  nextToUpdate3 = uVar40;
  ZSTD_optLdm_processMatchCandidate
            (&local_68,pZVar7,&nextToUpdate3,iVar26 - (int)puVar41,(int)pBVar2 - iVar26);
  UVar15 = nextToUpdate3;
  poVar45 = local_148;
  uVar42 = (ulong)nextToUpdate3;
  if (uVar42 == 0) {
    local_1b8 = (uint *)((long)local_1b8 + 1);
    goto LAB_001ec08d;
  }
  for (lVar22 = 4; lVar22 != 7; lVar22 = lVar22 + 1) {
    pZVar5->rep[lVar22 + -4] = local_d8[-2][lVar22 + 2];
  }
  pZVar5->mlen = 0;
  pZVar5->litlen = (U32)local_158;
  UVar12 = ZSTD_litLengthPrice((U32)local_158,local_148,2);
  pZVar5->price = UVar12;
  uVar40 = pZVar7[UVar15 - 1].len;
  if ((uint)local_78 < uVar40) {
    UVar16 = pZVar7[UVar15 - 1].off;
    uVar42 = 0;
    UVar15 = (U32)local_158;
  }
  else {
    UVar15 = ZSTD_litLengthPrice(0,poVar45,2);
    pZVar28 = local_98;
    for (uVar33 = 1; uVar33 < local_c0; uVar33 = uVar33 + 1) {
      pZVar28->price = 0x40000000;
      pZVar28 = pZVar28 + 1;
    }
    for (uVar44 = 0; uVar44 != uVar42; uVar44 = uVar44 + 1) {
      UVar16 = pZVar7[uVar44].off;
      uVar11 = pZVar7[uVar44].len;
      uVar40 = UVar16 + 1;
      uVar36 = 0x1f;
      if (uVar40 != 0) {
        for (; uVar40 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar40 = (int)uVar33 * 0x100 - 0x200;
      while (uVar37 = (uint)uVar33, uVar37 <= uVar11) {
        if ((ms->opt).priceType == zop_predef) {
          iVar26 = 0x1f;
          if (uVar37 - 2 != 0) {
            for (; uVar37 - 2 >> iVar26 == 0; iVar26 = iVar26 + -1) {
            }
          }
          iVar26 = (iVar26 + uVar36) * 0x100 + (uVar40 >> ((byte)iVar26 & 0x1f)) + 0x1000;
        }
        else {
          uVar13 = uVar37 - 3;
          uVar38 = (ms->opt).offCodeFreq[uVar36] + 1;
          iVar26 = 0x1f;
          if (uVar38 != 0) {
            for (; uVar38 >> iVar26 == 0; iVar26 = iVar26 + -1) {
            }
          }
          if (uVar13 < 0x80) {
            uVar13 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar13];
          }
          else {
            uVar43 = 0x1f;
            if (uVar13 != 0) {
              for (; uVar13 >> uVar43 == 0; uVar43 = uVar43 - 1) {
              }
            }
            uVar13 = (uVar43 ^ 0xffffffe0) + 0x44;
          }
          uVar43 = (ms->opt).matchLengthFreq[uVar13] + 1;
          iVar34 = 0x1f;
          if (uVar43 != 0) {
            for (; uVar43 >> iVar34 == 0; iVar34 = iVar34 + -1) {
            }
          }
          iVar26 = ((ML_bits[uVar13] + uVar36) - (iVar26 + iVar34)) * 0x100 +
                   (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar38 * 0x100 >> ((byte)iVar26 & 0x1f)) +
                   (uVar43 * 0x100 >> ((byte)iVar34 & 0x1f)))) + 0x33;
        }
        uVar33 = uVar33 & 0xffffffff;
        pZVar5[uVar33].mlen = uVar37;
        pZVar5[uVar33].off = UVar16;
        pZVar5[uVar33].litlen = (U32)local_158;
        pZVar5[uVar33].price = iVar26 + UVar15 + UVar12;
        uVar40 = uVar40 + 0x100;
        uVar33 = (ulong)(uVar37 + 1);
      }
    }
    uVar42 = (ulong)((int)uVar33 - 1);
    uVar33 = 1;
LAB_001ed300:
    poVar45 = local_148;
    uVar11 = (uint)uVar33;
    uVar36 = (uint)uVar42;
    if (uVar11 <= uVar36) {
      pZVar28 = pZVar5 + (uVar11 - 1);
      UVar15 = 1;
      if (pZVar5[uVar11 - 1].mlen == 0) {
        UVar15 = pZVar28->litlen + 1;
      }
      puVar41 = (uint *)((long)local_1b8 + uVar33);
      local_158._0_4_ = pZVar28->price;
      UVar12 = ZSTD_rawLiteralsCost
                         ((BYTE *)((long)puVar41 + -1),(U32)local_148,(optState_t *)0x2,
                          (U32)local_158);
      UVar16 = ZSTD_litLengthPrice(UVar15,poVar45,2);
      iVar34 = UVar16 + UVar12 + (U32)local_158;
      UVar12 = ZSTD_litLengthPrice(UVar15 - 1,poVar45,2);
      iVar34 = iVar34 - UVar12;
      pZVar3 = pZVar5 + uVar33;
      iVar26 = pZVar5[uVar33].price;
      if (iVar26 < iVar34) {
        local_e8 = &pZVar3->mlen;
        iVar34 = iVar26;
        if (pZVar3->mlen == 0) goto LAB_001ed42d;
        rVar47 = ZSTD_updateRep(pZVar5[uVar11 - pZVar3->mlen].rep,pZVar3->off,
                                (uint)(pZVar3->litlen == 0));
        *&pZVar3->rep = rVar47.rep;
        uVar40 = 1;
        bVar46 = false;
      }
      else {
        pZVar3->off = 0;
        pZVar3->mlen = 0;
        pZVar3->litlen = UVar15;
        pZVar3->price = iVar34;
LAB_001ed42d:
        local_e8 = &pZVar3->mlen;
        pZVar3->rep[2] = pZVar28->rep[2];
        *(undefined8 *)pZVar3->rep = *(undefined8 *)pZVar28->rep;
        bVar46 = true;
        uVar40 = 0;
      }
      if (local_150 < puVar41) goto LAB_001ee7fe;
      if (uVar11 != uVar36) {
        UVar15 = 0;
        if (bVar46) {
          UVar15 = pZVar3->litlen;
        }
        local_158._0_4_ = ZSTD_litLengthPrice(0,local_148,2);
        pUVar8 = local_80;
        pBVar31 = (ms->window).base;
        uVar44 = (ulong)ms->nextToUpdate;
        iVar26 = (int)puVar41;
        if (pBVar31 + uVar44 <= puVar41) {
          UVar12 = (ms->cParams).minMatch;
          uVar36 = iVar26 - (int)pBVar31;
          for (; (uint)uVar44 < uVar36; uVar44 = (ulong)((uint)uVar44 + UVar16)) {
            UVar16 = ZSTD_insertBt1(ms,pBVar31 + uVar44,pBVar2,UVar12,0);
          }
          ms->nextToUpdate = uVar36;
          puVar35 = (uint *)(ulong)uVar40;
          if (UVar12 - 6 < 2) {
            uVar36 = (ms->cParams).targetLength;
            if (0xffe < uVar36) {
              uVar36 = 0xfff;
            }
            local_140 = (uint *)(ms->window).base;
            uVar13 = iVar26 - (int)local_140;
            local_108 = (ulong)(*(long *)puVar41 * -0x30e4432340650000) >>
                        (-(char)(ms->cParams).hashLog & 0x3fU);
            uVar38 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar17 = uVar13 - uVar38;
            uVar37 = 0;
            if (uVar13 < uVar38) {
              iVar17 = 0;
            }
            local_160 = (U32 *)CONCAT44(local_160._4_4_,iVar17);
            uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar12 = (ms->window).lowLimit;
            UVar16 = uVar13 - uVar43;
            if (uVar13 - UVar12 <= uVar43) {
              UVar16 = UVar12;
            }
            local_118 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              UVar16 = UVar12;
            }
            local_168 = (uint *)CONCAT44(local_168._4_4_,UVar16 + (UVar16 == 0));
            local_170 = (U32 *)CONCAT44(local_170._4_4_,uVar38);
            uVar44 = (ulong)((uVar38 & uVar13) * 2);
            local_190 = local_118 + uVar44;
            local_1f0 = local_118 + uVar44 + 1;
            UVar12 = (ms->window).dictLimit;
            iVar14 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_110 = ms->hashTable;
            local_100 = (ulong)local_110[local_108];
            iVar17 = uVar13 + 9;
            puVar24 = (uint *)((long)puVar35 + 3);
            local_c8 = puVar41 + 1;
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar36);
            local_120 = CONCAT44(local_120._4_4_,UVar16);
            pBVar31 = local_b8;
            local_128 = puVar24;
            for (; puVar35 < puVar24; puVar35 = (uint *)((long)puVar35 + 1)) {
              if (puVar35 == (uint *)0x3) {
                uVar38 = pZVar3->rep[0] - 1;
              }
              else {
                uVar38 = pUVar8[uVar33 * 7 + (long)puVar35];
              }
              uVar43 = 0;
              if (((uVar38 - 1 < uVar13 - UVar12) && (uVar43 = 0, UVar16 <= uVar13 - uVar38)) &&
                 (*puVar41 == *(uint *)((long)puVar41 - (ulong)uVar38))) {
                sVar19 = ZSTD_count((BYTE *)local_c8,(BYTE *)((long)local_c8 - (ulong)uVar38),pBVar2
                                   );
                uVar43 = (int)sVar19 + 4;
                puVar24 = local_128;
                uVar36 = (uint)local_f8;
                UVar16 = (uint)local_120;
              }
              uVar44 = (ulong)uVar43;
              if (pBVar31 < uVar44) {
                pZVar7[uVar37].off = (int)puVar35 - uVar40;
                pZVar7[uVar37].len = uVar43;
                uVar37 = uVar37 + 1;
                if ((uVar36 < uVar43) ||
                   (pBVar31 = (BYTE *)uVar44, (BYTE *)((long)puVar41 + uVar44) == pBVar2))
                goto LAB_001ee5f6;
              }
            }
            local_110[local_108] = uVar13;
            uVar33 = 0;
            uVar44 = 0;
            uVar21 = local_100;
            while (puVar35 = local_140, bVar46 = iVar14 != 0, iVar14 = iVar14 + -1, iVar27 = iVar17,
                  bVar46) {
              uVar40 = (uint)uVar21;
              if (uVar40 < (uint)local_168) break;
              uVar20 = uVar33;
              if (uVar44 < uVar33) {
                uVar20 = uVar44;
              }
              sVar19 = ZSTD_count((BYTE *)((long)puVar41 + uVar20),
                                  (BYTE *)((long)local_140 + uVar20 + (uVar21 & 0xffffffff)),pBVar2)
              ;
              uVar20 = sVar19 + uVar20;
              if (pBVar31 < uVar20) {
                iVar27 = uVar40 + (U32)uVar20;
                if (uVar20 <= iVar17 - uVar40) {
                  iVar27 = iVar17;
                }
                pZVar7[uVar37].off = (uVar13 + 2) - uVar40;
                pZVar7[uVar37].len = (U32)uVar20;
                uVar37 = uVar37 + 1;
                if ((0x1000 < uVar20) ||
                   (pBVar31 = (BYTE *)uVar20, iVar17 = iVar27,
                   (BYTE *)((long)puVar41 + uVar20) == pBVar2)) break;
              }
              puVar24 = local_118 + (uVar40 & (uint)local_170) * 2;
              if (*(byte *)((long)puVar35 + uVar20 + (uVar21 & 0xffffffff)) <
                  *(byte *)((long)puVar41 + uVar20)) {
                *local_190 = uVar40;
                if (uVar40 <= (uint)local_160) goto LAB_001ee3ef;
                puVar24 = puVar24 + 1;
                uVar44 = uVar20;
                local_190 = puVar24;
              }
              else {
                *local_1f0 = uVar40;
                local_1f0 = puVar24;
                uVar33 = uVar20;
                if (uVar40 <= (uint)local_160) goto LAB_001ee3fe;
              }
              uVar21 = (ulong)*puVar24;
            }
            goto LAB_001ee40b;
          }
          if (UVar12 == 5) {
            uVar36 = (ms->cParams).targetLength;
            if (0xffe < uVar36) {
              uVar36 = 0xfff;
            }
            local_140 = (uint *)(ms->window).base;
            uVar13 = iVar26 - (int)local_140;
            local_108 = (ulong)(*(long *)puVar41 * -0x30e4432345000000) >>
                        (-(char)(ms->cParams).hashLog & 0x3fU);
            uVar38 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar17 = uVar13 - uVar38;
            uVar37 = 0;
            if (uVar13 < uVar38) {
              iVar17 = 0;
            }
            local_160 = (U32 *)CONCAT44(local_160._4_4_,iVar17);
            uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar12 = (ms->window).lowLimit;
            UVar16 = uVar13 - uVar43;
            if (uVar13 - UVar12 <= uVar43) {
              UVar16 = UVar12;
            }
            local_118 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              UVar16 = UVar12;
            }
            local_168 = (uint *)CONCAT44(local_168._4_4_,UVar16 + (UVar16 == 0));
            local_170 = (U32 *)CONCAT44(local_170._4_4_,uVar38);
            uVar44 = (ulong)((uVar38 & uVar13) * 2);
            local_190 = local_118 + uVar44;
            local_1f0 = local_118 + uVar44 + 1;
            UVar12 = (ms->window).dictLimit;
            iVar14 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_110 = ms->hashTable;
            local_100 = (ulong)local_110[local_108];
            iVar17 = uVar13 + 9;
            puVar24 = (uint *)((long)puVar35 + 3);
            local_c8 = puVar41 + 1;
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar36);
            local_120 = CONCAT44(local_120._4_4_,UVar16);
            pBVar31 = local_b8;
            local_128 = puVar24;
            for (; puVar35 < puVar24; puVar35 = (uint *)((long)puVar35 + 1)) {
              if (puVar35 == (uint *)0x3) {
                uVar38 = pZVar3->rep[0] - 1;
              }
              else {
                uVar38 = pUVar8[uVar33 * 7 + (long)puVar35];
              }
              uVar43 = 0;
              if (((uVar38 - 1 < uVar13 - UVar12) && (uVar43 = 0, UVar16 <= uVar13 - uVar38)) &&
                 (*puVar41 == *(uint *)((long)puVar41 - (ulong)uVar38))) {
                sVar19 = ZSTD_count((BYTE *)local_c8,(BYTE *)((long)local_c8 - (ulong)uVar38),pBVar2
                                   );
                uVar43 = (int)sVar19 + 4;
                puVar24 = local_128;
                uVar36 = (uint)local_f8;
                UVar16 = (uint)local_120;
              }
              uVar44 = (ulong)uVar43;
              if (pBVar31 < uVar44) {
                pZVar7[uVar37].off = (int)puVar35 - uVar40;
                pZVar7[uVar37].len = uVar43;
                uVar37 = uVar37 + 1;
                if ((uVar36 < uVar43) ||
                   (pBVar31 = (BYTE *)uVar44, (BYTE *)((long)puVar41 + uVar44) == pBVar2))
                goto LAB_001ee5f6;
              }
            }
            local_110[local_108] = uVar13;
            uVar33 = 0;
            uVar44 = 0;
            uVar21 = local_100;
            while (puVar35 = local_140, bVar46 = iVar14 != 0, iVar14 = iVar14 + -1, iVar27 = iVar17,
                  bVar46) {
              uVar40 = (uint)uVar21;
              if (uVar40 < (uint)local_168) break;
              uVar20 = uVar33;
              if (uVar44 < uVar33) {
                uVar20 = uVar44;
              }
              sVar19 = ZSTD_count((BYTE *)((long)puVar41 + uVar20),
                                  (BYTE *)((long)local_140 + uVar20 + (uVar21 & 0xffffffff)),pBVar2)
              ;
              uVar20 = sVar19 + uVar20;
              if (pBVar31 < uVar20) {
                iVar27 = uVar40 + (U32)uVar20;
                if (uVar20 <= iVar17 - uVar40) {
                  iVar27 = iVar17;
                }
                pZVar7[uVar37].off = (uVar13 + 2) - uVar40;
                pZVar7[uVar37].len = (U32)uVar20;
                uVar37 = uVar37 + 1;
                if ((0x1000 < uVar20) ||
                   (pBVar31 = (BYTE *)uVar20, iVar17 = iVar27,
                   (BYTE *)((long)puVar41 + uVar20) == pBVar2)) break;
              }
              puVar24 = local_118 + (uVar40 & (uint)local_170) * 2;
              if (*(byte *)((long)puVar35 + uVar20 + (uVar21 & 0xffffffff)) <
                  *(byte *)((long)puVar41 + uVar20)) {
                *local_190 = uVar40;
                if (uVar40 <= (uint)local_160) goto LAB_001ee3ef;
                puVar24 = puVar24 + 1;
                uVar44 = uVar20;
                local_190 = puVar24;
              }
              else {
                *local_1f0 = uVar40;
                local_1f0 = puVar24;
                uVar33 = uVar20;
                if (uVar40 <= (uint)local_160) goto LAB_001ee3fe;
              }
              uVar21 = (ulong)*puVar24;
            }
            goto LAB_001ee40b;
          }
          if (UVar12 != 3) {
            uVar36 = (ms->cParams).targetLength;
            if (0xffe < uVar36) {
              uVar36 = 0xfff;
            }
            local_140 = (uint *)(ms->window).base;
            uVar13 = iVar26 - (int)local_140;
            local_108 = (ulong)(*puVar41 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar38 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar17 = uVar13 - uVar38;
            uVar37 = 0;
            if (uVar13 < uVar38) {
              iVar17 = 0;
            }
            local_160 = (U32 *)CONCAT44(local_160._4_4_,iVar17);
            uVar43 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar12 = (ms->window).lowLimit;
            UVar16 = uVar13 - uVar43;
            if (uVar13 - UVar12 <= uVar43) {
              UVar16 = UVar12;
            }
            local_118 = ms->chainTable;
            if (ms->loadedDictEnd != 0) {
              UVar16 = UVar12;
            }
            local_168 = (uint *)CONCAT44(local_168._4_4_,UVar16 + (UVar16 == 0));
            local_170 = (U32 *)CONCAT44(local_170._4_4_,uVar38);
            uVar44 = (ulong)((uVar38 & uVar13) * 2);
            local_190 = local_118 + uVar44;
            local_1f0 = local_118 + uVar44 + 1;
            UVar12 = (ms->window).dictLimit;
            iVar14 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_110 = ms->hashTable;
            local_100 = (ulong)local_110[local_108];
            iVar17 = uVar13 + 9;
            puVar24 = (uint *)((long)puVar35 + 3);
            local_c8 = puVar41 + 1;
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar36);
            local_120 = CONCAT44(local_120._4_4_,UVar16);
            pBVar31 = local_b8;
            local_128 = puVar24;
            for (; puVar35 < puVar24; puVar35 = (uint *)((long)puVar35 + 1)) {
              if (puVar35 == (uint *)0x3) {
                uVar38 = pZVar3->rep[0] - 1;
              }
              else {
                uVar38 = pUVar8[uVar33 * 7 + (long)puVar35];
              }
              uVar43 = 0;
              if (((uVar38 - 1 < uVar13 - UVar12) && (uVar43 = 0, UVar16 <= uVar13 - uVar38)) &&
                 (*puVar41 == *(uint *)((long)puVar41 - (ulong)uVar38))) {
                sVar19 = ZSTD_count((BYTE *)local_c8,(BYTE *)((long)local_c8 - (ulong)uVar38),pBVar2
                                   );
                uVar43 = (int)sVar19 + 4;
                puVar24 = local_128;
                uVar36 = (uint)local_f8;
                UVar16 = (uint)local_120;
              }
              uVar44 = (ulong)uVar43;
              if (pBVar31 < uVar44) {
                pZVar7[uVar37].off = (int)puVar35 - uVar40;
                pZVar7[uVar37].len = uVar43;
                uVar37 = uVar37 + 1;
                if ((uVar36 < uVar43) ||
                   (pBVar31 = (BYTE *)uVar44, (BYTE *)((long)puVar41 + uVar44) == pBVar2))
                goto LAB_001ee5f6;
              }
            }
            local_110[local_108] = uVar13;
            uVar33 = 0;
            uVar44 = 0;
            uVar21 = local_100;
            while (puVar35 = local_140, bVar46 = iVar14 != 0, iVar14 = iVar14 + -1, iVar27 = iVar17,
                  bVar46) {
              uVar40 = (uint)uVar21;
              if (uVar40 < (uint)local_168) break;
              uVar20 = uVar33;
              if (uVar44 < uVar33) {
                uVar20 = uVar44;
              }
              sVar19 = ZSTD_count((BYTE *)((long)puVar41 + uVar20),
                                  (BYTE *)((long)local_140 + uVar20 + (uVar21 & 0xffffffff)),pBVar2)
              ;
              uVar20 = sVar19 + uVar20;
              if (pBVar31 < uVar20) {
                iVar27 = uVar40 + (U32)uVar20;
                if (uVar20 <= iVar17 - uVar40) {
                  iVar27 = iVar17;
                }
                pZVar7[uVar37].off = (uVar13 + 2) - uVar40;
                pZVar7[uVar37].len = (U32)uVar20;
                uVar37 = uVar37 + 1;
                if ((0x1000 < uVar20) ||
                   (pBVar31 = (BYTE *)uVar20, iVar17 = iVar27,
                   (BYTE *)((long)puVar41 + uVar20) == pBVar2)) break;
              }
              puVar24 = local_118 + (uVar40 & (uint)local_170) * 2;
              if (*(byte *)((long)puVar35 + uVar20 + (uVar21 & 0xffffffff)) <
                  *(byte *)((long)puVar41 + uVar20)) {
                *local_190 = uVar40;
                if (uVar40 <= (uint)local_160) goto LAB_001ee3ef;
                puVar24 = puVar24 + 1;
                uVar44 = uVar20;
                local_190 = puVar24;
              }
              else {
                *local_1f0 = uVar40;
                local_1f0 = puVar24;
                uVar33 = uVar20;
                if (uVar40 <= (uint)local_160) goto LAB_001ee3fe;
              }
              uVar21 = (ulong)*puVar24;
            }
            goto LAB_001ee40b;
          }
          uVar36 = (ms->cParams).targetLength;
          if (0xffe < uVar36) {
            uVar36 = 0xfff;
          }
          local_160 = (U32 *)(ms->window).base;
          uVar13 = iVar26 - (int)local_160;
          local_108 = (ulong)(*puVar41 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
          uVar38 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar17 = uVar13 - uVar38;
          uVar37 = 0;
          if (uVar13 < uVar38) {
            iVar17 = 0;
          }
          local_120 = CONCAT44(local_120._4_4_,iVar17);
          uVar18 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar43 = (ms->window).lowLimit;
          uVar32 = uVar13 - uVar18;
          if (uVar13 - uVar43 <= uVar18) {
            uVar32 = uVar43;
          }
          local_f8 = ms->chainTable;
          if (ms->loadedDictEnd != 0) {
            uVar32 = uVar43;
          }
          local_170 = (U32 *)CONCAT44(local_170._4_4_,uVar32 + (uVar32 == 0));
          local_118 = (U32 *)CONCAT44(local_118._4_4_,uVar38);
          uVar44 = (ulong)((uVar38 & uVar13) * 2);
          local_140 = local_f8 + uVar44;
          local_1d0 = local_f8 + uVar44 + 1;
          UVar12 = (ms->window).dictLimit;
          iVar14 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_168 = (uint *)(ulong)-uVar40;
          local_110 = ms->hashTable;
          local_100 = (ulong)local_110[local_108];
          iVar17 = uVar13 + 9;
          puVar24 = (uint *)((long)puVar35 + 3);
          local_c8 = (uint *)((long)puVar41 + 3);
          local_128 = (uint *)CONCAT44(local_128._4_4_,uVar36);
          pBVar31 = local_b8;
          for (; puVar35 < puVar24; puVar35 = (uint *)((long)puVar35 + 1)) {
            if (puVar35 == (uint *)0x3) {
              uVar40 = pZVar3->rep[0] - 1;
            }
            else {
              uVar40 = pUVar8[uVar33 * 7 + (long)puVar35];
            }
            uVar38 = 0;
            if (((uVar40 - 1 < uVar13 - UVar12) && (uVar38 = 0, uVar32 <= uVar13 - uVar40)) &&
               (((*(uint *)((long)puVar41 - (ulong)uVar40) ^ *puVar41) & 0xffffff) == 0)) {
              sVar19 = ZSTD_count((BYTE *)local_c8,(BYTE *)((long)local_c8 - (ulong)uVar40),pBVar2);
              uVar38 = (int)sVar19 + 3;
              uVar36 = (uint)local_128;
            }
            uVar44 = (ulong)uVar38;
            if (pBVar31 < uVar44) {
              pZVar7[uVar37].off = (int)local_168 + (int)puVar35;
              pZVar7[uVar37].len = uVar38;
              uVar37 = uVar37 + 1;
              if ((uVar36 < uVar38) ||
                 (pBVar31 = (BYTE *)uVar44, (BYTE *)((long)puVar41 + uVar44) == pBVar2))
              goto LAB_001ee5f6;
            }
          }
          if (pBVar31 < 3) {
            UVar12 = ZSTD_insertAndFindFirstIndexHash3(ms,&nextToUpdate3_1,(BYTE *)puVar41);
            if (((UVar12 < (uint)local_170) || (0x3ffff < uVar13 - UVar12)) ||
               (sVar19 = ZSTD_count((BYTE *)puVar41,(BYTE *)((ulong)UVar12 + (long)local_160),pBVar2
                                   ), sVar19 < 3)) goto LAB_001ee426;
            pZVar7->off = (uVar13 - UVar12) + 2;
            pZVar7->len = (U32)sVar19;
            uVar37 = 1;
            pBVar31 = (BYTE *)sVar19;
            if (sVar19 <= ((ulong)local_128 & 0xffffffff) &&
                (BYTE *)(sVar19 + (long)puVar41) != pBVar2) goto LAB_001ee426;
            UVar12 = uVar13 + 1;
            uVar37 = 1;
          }
          else {
LAB_001ee426:
            local_110[local_108] = uVar13;
            uVar33 = 0;
            uVar44 = 0;
            uVar21 = local_100;
            while (pUVar8 = local_160, bVar46 = iVar14 != 0, iVar14 = iVar14 + -1, bVar46) {
              uVar40 = (uint)uVar21;
              if (uVar40 < (uint)local_170) break;
              uVar20 = uVar33;
              if (uVar44 < uVar33) {
                uVar20 = uVar44;
              }
              sVar19 = ZSTD_count((BYTE *)((long)puVar41 + uVar20),
                                  (BYTE *)((long)local_160 + uVar20 + (uVar21 & 0xffffffff)),pBVar2)
              ;
              uVar20 = sVar19 + uVar20;
              if (pBVar31 < uVar20) {
                iVar27 = uVar40 + (U32)uVar20;
                if (uVar20 <= iVar17 - uVar40) {
                  iVar27 = iVar17;
                }
                pZVar7[uVar37].off = (uVar13 + 2) - uVar40;
                pZVar7[uVar37].len = (U32)uVar20;
                uVar37 = uVar37 + 1;
                iVar17 = iVar27;
                if ((0x1000 < uVar20) ||
                   (pBVar31 = (BYTE *)uVar20, (BYTE *)((long)puVar41 + uVar20) == pBVar2)) break;
              }
              puVar35 = local_f8 + (uVar40 & (uint)local_118) * 2;
              if (*(byte *)((long)pUVar8 + uVar20 + (uVar21 & 0xffffffff)) <
                  *(byte *)((long)puVar41 + uVar20)) {
                *local_140 = uVar40;
                if (uVar40 <= (uint)local_120) {
                  local_140 = local_138;
                  break;
                }
                puVar35 = puVar35 + 1;
                uVar44 = uVar20;
                local_140 = puVar35;
              }
              else {
                *local_1d0 = uVar40;
                local_1d0 = puVar35;
                uVar33 = uVar20;
                if (uVar40 <= (uint)local_120) {
                  local_1d0 = local_138;
                  break;
                }
              }
              uVar21 = (ulong)*puVar35;
            }
            *local_1d0 = 0;
            *local_140 = 0;
            UVar12 = iVar17 - 8;
          }
          goto LAB_001ee5f1;
        }
        uVar37 = 0;
        goto LAB_001ee5f6;
      }
    }
    uVar42 = uVar42 & 0xffffffff;
    local_ac = pZVar5[uVar42].price;
    UVar16 = pZVar5[uVar42].off;
    uVar40 = pZVar5[uVar42].mlen;
    UVar15 = pZVar5[uVar42].litlen;
    local_88 = pZVar5[uVar42].rep[2];
    local_90 = *(undefined8 *)pZVar5[uVar42].rep;
    uVar37 = uVar36 - (uVar40 + UVar15);
    if (uVar36 < uVar40 + UVar15) {
      uVar37 = 0;
    }
LAB_001ee850:
    uVar42 = (ulong)uVar37;
    if (uVar40 == 0) {
      (*local_d8)[2] = pZVar5[uVar42].rep[2];
      *(undefined8 *)*local_d8 = *(undefined8 *)pZVar5[uVar42].rep;
      uVar40 = 0;
      poVar45 = local_f0;
      goto LAB_001ee88d;
    }
  }
  poVar45 = local_f0;
  rVar47 = ZSTD_updateRep(pZVar5[uVar42].rep,UVar16,(uint)(UVar15 == 0));
  *local_d8 = rVar47.rep;
LAB_001ee88d:
  local_158 = (ulong)((int)uVar42 + 1);
  pZVar5[local_158].price = local_ac;
  pZVar5[local_158].off = UVar16;
  pZVar5[local_158].mlen = uVar40;
  pZVar5[local_158].litlen = UVar15;
  *(undefined8 *)pZVar5[local_158].rep = local_90;
  pZVar5[local_158].rep[2] = local_88;
  uVar33 = uVar42;
  while (uVar40 = (uint)uVar42, uVar40 != 0) {
    uVar11 = pZVar5[uVar42].litlen + pZVar5[uVar42].mlen;
    pZVar28 = pZVar5 + uVar42;
    iVar26 = pZVar28->price;
    UVar12 = pZVar28->off;
    UVar16 = pZVar28->mlen;
    UVar10 = pZVar28->litlen;
    pZVar28 = pZVar5 + uVar42;
    UVar15 = pZVar28->rep[0];
    uVar9 = *(undefined8 *)(&pZVar28->litlen + 2);
    pZVar3 = pZVar5 + uVar33;
    pZVar3->litlen = pZVar28->litlen;
    pZVar3->rep[0] = UVar15;
    *(undefined8 *)(&pZVar3->litlen + 2) = uVar9;
    pZVar28 = pZVar5 + uVar33;
    pZVar28->price = iVar26;
    pZVar28->off = UVar12;
    pZVar28->mlen = UVar16;
    pZVar28->litlen = UVar10;
    uVar42 = (ulong)(uVar40 - uVar11);
    if (uVar40 < uVar11) {
      uVar42 = 0;
    }
    uVar33 = (ulong)((int)uVar33 - 1);
  }
  while( true ) {
    uVar40 = (int)uVar33 + 1;
    uVar33 = (ulong)uVar40;
    if ((U32)local_158 < uVar40) break;
    UVar15 = pZVar5[uVar33].mlen;
    uVar40 = pZVar5[uVar33].litlen;
    uVar42 = (ulong)uVar40;
    if (UVar15 == 0) {
      local_1b8 = (uint *)(uVar42 + (long)poVar45);
    }
    else {
      UVar12 = pZVar5[uVar33].off;
      ZSTD_updateStats(local_148,uVar40,(BYTE *)poVar45,UVar12,UVar15);
      pBVar31 = local_a8->lit;
      if (local_70 < (BYTE *)((long)poVar45 + uVar42)) {
        ZSTD_safecopyLiterals
                  (pBVar31,(BYTE *)poVar45,(BYTE *)((long)poVar45 + uVar42),(BYTE *)local_70);
LAB_001ee982:
        local_a8->lit = local_a8->lit + uVar42;
        psVar25 = local_a8->sequences;
        if (0xffff < uVar40) {
          local_a8->longLengthType = ZSTD_llt_literalLength;
          local_a8->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)local_a8->sequencesStart) >> 3);
        }
      }
      else {
        uVar9 = *(undefined8 *)((long)poVar45 + 8);
        *(undefined8 *)pBVar31 = poVar45->litFreq;
        *(undefined8 *)(pBVar31 + 8) = uVar9;
        if (0x10 < uVar40) {
          pBVar31 = local_a8->lit;
          uVar9 = *(undefined8 *)((long)poVar45 + 0x18);
          *(undefined8 *)(pBVar31 + 0x10) = *(undefined8 *)((long)poVar45 + 0x10);
          *(undefined8 *)(pBVar31 + 0x18) = uVar9;
          if (0x10 < uVar42 - 0x10) {
            lVar22 = 0;
            do {
              puVar4 = (undefined8 *)((long)poVar45 + lVar22 + 0x20);
              uVar9 = puVar4[1];
              pBVar30 = pBVar31 + lVar22 + 0x20;
              *(undefined8 *)pBVar30 = *puVar4;
              *(undefined8 *)(pBVar30 + 8) = uVar9;
              puVar4 = (undefined8 *)((long)poVar45 + lVar22 + 0x30);
              uVar9 = puVar4[1];
              *(undefined8 *)(pBVar30 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar30 + 0x18) = uVar9;
              lVar22 = lVar22 + 0x20;
            } while (pBVar30 + 0x20 < pBVar31 + uVar42);
            goto LAB_001ee982;
          }
        }
        local_a8->lit = local_a8->lit + uVar42;
        psVar25 = local_a8->sequences;
      }
      psVar25->litLength = (U16)uVar40;
      psVar25->offset = UVar12 + 1;
      if (0xffff < UVar15 - 3) {
        local_a8->longLengthType = ZSTD_llt_matchLength;
        local_a8->longLengthPos =
             (U32)((ulong)((long)psVar25 - (long)local_a8->sequencesStart) >> 3);
      }
      psVar25->matchLength = (U16)(UVar15 - 3);
      local_a8->sequences = psVar25 + 1;
      poVar45 = (optState_t *)((long)poVar45 + (ulong)(UVar15 + uVar40));
      local_1b8 = (uint *)poVar45;
    }
  }
  local_f0 = poVar45;
  ZSTD_setBasePrices(local_148,2);
  puVar41 = local_e0;
  goto LAB_001ec08d;
LAB_001ee3fe:
  local_1f0 = local_138;
  iVar27 = iVar17;
  goto LAB_001ee40b;
LAB_001ee3ef:
  local_190 = local_138;
  iVar27 = iVar17;
LAB_001ee40b:
  *local_1f0 = 0;
  *local_190 = 0;
  UVar12 = iVar27 - 8;
LAB_001ee5f1:
  ms->nextToUpdate = UVar12;
LAB_001ee5f6:
  nextToUpdate3 = uVar37;
  ZSTD_optLdm_processMatchCandidate
            (&local_68,pZVar7,&nextToUpdate3,iVar26 - (int)local_e0,(int)pBVar2 - iVar26);
  if ((ulong)nextToUpdate3 != 0) {
    uVar40 = pZVar7[nextToUpdate3 - 1].len;
    if (((uint)local_78 < uVar40) || (0xfff < uVar11 + uVar40)) {
      UVar12 = 0;
      if (*local_e8 == 0) {
        UVar12 = pZVar3->litlen;
      }
      UVar16 = pZVar7[nextToUpdate3 - 1].off;
      uVar37 = uVar11 - UVar12;
      if (0x1000 < uVar11 - UVar12) {
        uVar37 = 0;
      }
      goto LAB_001ee850;
    }
    local_158._0_4_ = (U32)local_158 + iVar34;
    for (uVar33 = 0; uVar33 != nextToUpdate3; uVar33 = uVar33 + 1) {
      uVar40 = (uint)local_a0;
      if (uVar33 != 0) {
        uVar40 = pZVar7[uVar33 - 1].len + 1;
      }
      UVar12 = pZVar7[uVar33].off;
      UVar16 = pZVar7[uVar33].len;
      uVar37 = UVar12 + 1;
      uVar36 = 0x1f;
      if (uVar37 != 0) {
        for (; uVar37 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      for (; uVar40 <= UVar16; UVar16 = UVar16 - 1) {
        if ((ms->opt).priceType == zop_predef) {
          uVar37 = UVar16 - 2;
          iVar26 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> iVar26 == 0; iVar26 = iVar26 + -1) {
            }
          }
          iVar26 = (uVar37 * 0x100 >> ((byte)iVar26 & 0x1f)) + (iVar26 + uVar36) * 0x100 + 0x1000;
        }
        else {
          uVar37 = UVar16 - 3;
          uVar13 = (ms->opt).offCodeFreq[uVar36] + 1;
          iVar26 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> iVar26 == 0; iVar26 = iVar26 + -1) {
            }
          }
          if (uVar37 < 0x80) {
            uVar37 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar37];
          }
          else {
            uVar38 = 0x1f;
            if (uVar37 != 0) {
              for (; uVar37 >> uVar38 == 0; uVar38 = uVar38 - 1) {
              }
            }
            uVar37 = (uVar38 ^ 0xffffffe0) + 0x44;
          }
          uVar38 = (ms->opt).matchLengthFreq[uVar37] + 1;
          iVar34 = 0x1f;
          if (uVar38 != 0) {
            for (; uVar38 >> iVar34 == 0; iVar34 = iVar34 + -1) {
            }
          }
          iVar26 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar13 * 0x100 >> ((byte)iVar26 & 0x1f)) +
                   (uVar38 * 0x100 >> ((byte)iVar34 & 0x1f)))) +
                   ((ML_bits[uVar37] + uVar36) - (iVar26 + iVar34)) * 0x100 + 0x33;
        }
        uVar44 = (ulong)(UVar16 + uVar11);
        if (((uint)uVar42 < UVar16 + uVar11) ||
           ((int)(iVar26 + (U32)local_158) < pZVar5[uVar44].price)) {
          uVar42 = uVar42 & 0xffffffff;
          pZVar28 = local_98 + uVar42;
          for (; uVar42 < uVar44; uVar42 = uVar42 + 1) {
            pZVar28->price = 0x40000000;
            pZVar28 = pZVar28 + 1;
          }
          pZVar5[uVar44].mlen = UVar16;
          pZVar5[uVar44].off = UVar12;
          pZVar5[uVar44].litlen = UVar15;
          pZVar5[uVar44].price = iVar26 + (U32)local_158;
        }
      }
    }
  }
LAB_001ee7fe:
  uVar33 = (ulong)(uVar11 + 1);
  goto LAB_001ed300;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const curr = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (curr == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}